

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxwell.cpp
# Opt level: O1

void __thiscall five_point_solver::advance_b(five_point_solver *this)

{
  double dVar1;
  double dVar2;
  undefined8 uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  int iVar34;
  int iVar35;
  int iVar36;
  field3d<cellb> *pfVar37;
  celle **ppcVar38;
  celle *pcVar39;
  celle *pcVar40;
  celle *pcVar41;
  cellb *pcVar42;
  field3d<celle> *pfVar43;
  celle ***pppcVar44;
  celle **ppcVar45;
  cellb **ppcVar46;
  celle **ppcVar47;
  celle **ppcVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  long lVar55;
  byte bVar56;
  bool bVar57;
  ulong uVar58;
  ulong uVar59;
  long lVar60;
  long lVar61;
  ulong uVar62;
  long lVar63;
  ulong uVar64;
  ulong uVar65;
  ulong uVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar112 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined1 auVar74 [16];
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  undefined1 auVar131 [64];
  undefined1 auVar132 [64];
  undefined1 auVar133 [64];
  undefined1 auVar135 [64];
  undefined1 auVar136 [64];
  undefined1 auVar137 [64];
  undefined1 auVar138 [64];
  undefined1 auVar140 [64];
  undefined1 auVar141 [64];
  undefined1 auVar143 [64];
  undefined1 auVar144 [64];
  undefined1 auVar145 [64];
  undefined1 auVar147 [64];
  undefined1 auVar148 [64];
  undefined1 auVar150 [64];
  undefined1 auVar151 [64];
  undefined1 auVar152 [64];
  undefined1 auVar155 [64];
  undefined1 auVar156 [64];
  undefined1 auVar157 [64];
  undefined1 auVar158 [64];
  undefined1 auVar159 [64];
  undefined1 auVar160 [64];
  undefined1 auVar161 [64];
  undefined1 auVar162 [64];
  undefined1 auVar163 [64];
  undefined1 auVar164 [64];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 in_ZMM23 [64];
  undefined1 in_ZMM25 [64];
  undefined1 in_ZMM26 [64];
  undefined1 in_ZMM27 [64];
  undefined1 in_ZMM28 [64];
  undefined1 in_ZMM29 [64];
  undefined1 in_ZMM30 [64];
  undefined1 in_ZMM31 [64];
  ulong local_78;
  undefined1 auVar71 [16];
  undefined1 auVar110 [64];
  undefined1 auVar113 [64];
  undefined1 auVar111 [64];
  undefined1 auVar120 [64];
  undefined1 auVar123 [64];
  undefined1 auVar130 [64];
  undefined1 auVar134 [64];
  undefined1 auVar139 [64];
  undefined1 auVar142 [64];
  undefined1 auVar146 [64];
  undefined1 auVar149 [64];
  undefined1 auVar153 [64];
  undefined1 auVar154 [64];
  
  pfVar37 = (this->super_maxwell_solver).cb;
  iVar34 = pfVar37->nx;
  lVar61 = (long)iVar34;
  iVar35 = pfVar37->ny;
  lVar60 = (long)iVar35;
  iVar36 = pfVar37->nz;
  lVar63 = (long)iVar36;
  uVar59 = (ulong)(iVar34 - 2);
  if (3 < lVar61) {
    auVar86 = vpbroadcastq_avx512f();
    uVar66 = 1;
    auVar74._8_8_ = 0x8000000000000000;
    auVar74._0_8_ = 0x8000000000000000;
    auVar87 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar88 = vpbroadcastq_avx512f(ZEXT816(0x18));
    auVar89 = vbroadcastsd_avx512f(ZEXT816(0x3fe0000000000000));
    auVar90 = vpbroadcastq_avx512f(ZEXT816(8));
    do {
      if (3 < iVar35) {
        auVar67._8_8_ = 0;
        auVar67._0_8_ = (this->super_maxwell_solver).dtdy;
        auVar91 = vbroadcastsd_avx512f(auVar67);
        auVar185._0_8_ = auVar91._0_8_ ^ 0x8000000000000000;
        auVar185._8_8_ = auVar91._8_8_ ^ 0x8000000000000000;
        auVar68._8_8_ = 0;
        auVar68._0_8_ = (this->super_maxwell_solver).dtdz;
        auVar92 = vbroadcastsd_avx512f(auVar68);
        auVar85._8_8_ = 0;
        auVar85._0_8_ = (this->super_maxwell_solver).dtdx;
        auVar93 = vbroadcastsd_avx512f(auVar85);
        auVar83._8_8_ = 0;
        auVar83._0_8_ = this->ay;
        auVar94 = vbroadcastsd_avx512f(auVar83);
        auVar84._8_8_ = 0;
        auVar84._0_8_ = this->by;
        auVar95 = vbroadcastsd_avx512f(auVar84);
        auVar9._8_8_ = 0;
        auVar9._0_8_ = this->az;
        auVar96 = vbroadcastsd_avx512f(auVar9);
        auVar10._8_8_ = 0;
        auVar10._0_8_ = this->bz;
        auVar97 = vbroadcastsd_avx512f(auVar10);
        auVar67 = vxorpd_avx512vl(auVar92._0_16_,auVar74);
        auVar68 = vxorpd_avx512vl(auVar93._0_16_,auVar74);
        auVar98 = vbroadcastsd_avx512f(auVar185);
        auVar11._8_8_ = 0;
        auVar11._0_8_ = this->ax;
        auVar99 = vbroadcastsd_avx512f(auVar11);
        auVar12._8_8_ = 0;
        auVar12._0_8_ = this->bx;
        auVar100 = vbroadcastsd_avx512f(auVar12);
        auVar101 = vbroadcastsd_avx512f(auVar67);
        auVar102 = vbroadcastsd_avx512f(auVar68);
        uVar64 = 1;
        do {
          if (3 < iVar36) {
            ppcVar38 = (((this->super_maxwell_solver).ce)->p)._M_t.
                       super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                       super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                       super__Head_base<0UL,_celle_***,_false>._M_head_impl[uVar66];
            pcVar39 = ppcVar38[uVar64 + 1];
            pcVar40 = ppcVar38[uVar64];
            pcVar41 = ppcVar38[uVar64 + 2];
            pcVar42 = (pfVar37->p)._M_t.
                      super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                      super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                      super__Head_base<0UL,_cellb_***,_false>._M_head_impl[uVar66][uVar64];
            auVar103 = vpbroadcastq_avx512f();
            auVar104 = vpbroadcastq_avx512f();
            auVar105 = vpbroadcastq_avx512f();
            auVar106 = vpbroadcastq_avx512f();
            in_ZMM23 = vpbroadcastq_avx512f();
            uVar62 = 0;
            auVar107 = vpmovsxbq_avx512f(ZEXT816(0x807060504030201));
            do {
              auVar108 = vpbroadcastq_avx512f();
              auVar108 = vporq_avx512f(auVar108,auVar87);
              uVar65 = vpcmpuq_avx512f(auVar108,auVar86,2);
              auVar108 = vpmullq_avx512dq(auVar107,auVar88);
              auVar67 = vxorpd_avx512vl(in_ZMM26._0_16_,in_ZMM26._0_16_);
              vpaddq_avx512f(auVar103,auVar108);
              auVar109 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar39->ez + (long)pcVar40));
              bVar56 = (byte)uVar65;
              auVar112._0_8_ =
                   (ulong)(bVar56 & 1) * auVar109._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar67._0_8_
              ;
              bVar57 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar112._8_8_ = (ulong)bVar57 * auVar109._8_8_ | (ulong)!bVar57 * auVar67._8_8_;
              auVar112._16_8_ = (ulong)((byte)(uVar65 >> 2) & 1) * auVar109._16_8_;
              auVar112._24_8_ = (ulong)((byte)(uVar65 >> 3) & 1) * auVar109._24_8_;
              auVar112._32_8_ = (ulong)((byte)(uVar65 >> 4) & 1) * auVar109._32_8_;
              auVar112._40_8_ = (ulong)((byte)(uVar65 >> 5) & 1) * auVar109._40_8_;
              auVar112._48_8_ = (ulong)((byte)(uVar65 >> 6) & 1) * auVar109._48_8_;
              auVar112._56_8_ = (uVar65 >> 7) * auVar109._56_8_;
              auVar67 = vxorpd_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
              auVar110 = vgatherqpd_avx512f(pcVar41->ez);
              auVar69._0_8_ =
                   (ulong)(bVar56 & 1) * auVar110._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar67._0_8_
              ;
              bVar57 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar69._8_8_ = (ulong)bVar57 * auVar110._8_8_ | (ulong)!bVar57 * auVar67._8_8_;
              auVar109._16_8_ = (ulong)((byte)(uVar65 >> 2) & 1) * auVar110._16_8_;
              auVar109._0_16_ = auVar69;
              auVar109._24_8_ = (ulong)((byte)(uVar65 >> 3) & 1) * auVar110._24_8_;
              auVar109._32_8_ = (ulong)((byte)(uVar65 >> 4) & 1) * auVar110._32_8_;
              auVar109._40_8_ = (ulong)((byte)(uVar65 >> 5) & 1) * auVar110._40_8_;
              auVar109._48_8_ = (ulong)((byte)(uVar65 >> 6) & 1) * auVar110._48_8_;
              auVar109._56_8_ = (uVar65 >> 7) * auVar110._56_8_;
              auVar67 = vxorpd_avx512vl(in_ZMM28._0_16_,in_ZMM28._0_16_);
              auVar110 = vsubpd_avx512f(auVar112,auVar109);
              auVar111 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar41->ez + (long)pcVar40));
              auVar70._0_8_ =
                   (ulong)(bVar56 & 1) * auVar111._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar67._0_8_
              ;
              bVar57 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar70._8_8_ = (ulong)bVar57 * auVar111._8_8_ | (ulong)!bVar57 * auVar67._8_8_;
              auVar113._16_8_ = (ulong)((byte)(uVar65 >> 2) & 1) * auVar111._16_8_;
              auVar113._0_16_ = auVar70;
              auVar113._24_8_ = (ulong)((byte)(uVar65 >> 3) & 1) * auVar111._24_8_;
              auVar113._32_8_ = (ulong)((byte)(uVar65 >> 4) & 1) * auVar111._32_8_;
              auVar113._40_8_ = (ulong)((byte)(uVar65 >> 5) & 1) * auVar111._40_8_;
              auVar113._48_8_ = (ulong)((byte)(uVar65 >> 6) & 1) * auVar111._48_8_;
              auVar113._56_8_ = (uVar65 >> 7) * auVar111._56_8_;
              auVar112 = vsubpd_avx512f(auVar113,auVar112);
              auVar67 = vxorpd_avx512vl(auVar70,auVar70);
              auVar111 = vgatherqpd_avx512f(*(undefined8 *)
                                             ((long)&ppcVar38[uVar64 - 1]->ez + (long)pcVar40));
              auVar116._0_8_ =
                   (ulong)(bVar56 & 1) * auVar111._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar67._0_8_
              ;
              bVar57 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar116._8_8_ = (ulong)bVar57 * auVar111._8_8_ | (ulong)!bVar57 * auVar67._8_8_;
              auVar116._16_8_ = (ulong)((byte)(uVar65 >> 2) & 1) * auVar111._16_8_;
              auVar116._24_8_ = (ulong)((byte)(uVar65 >> 3) & 1) * auVar111._24_8_;
              auVar116._32_8_ = (ulong)((byte)(uVar65 >> 4) & 1) * auVar111._32_8_;
              auVar116._40_8_ = (ulong)((byte)(uVar65 >> 5) & 1) * auVar111._40_8_;
              auVar116._48_8_ = (ulong)((byte)(uVar65 >> 6) & 1) * auVar111._48_8_;
              auVar116._56_8_ = (uVar65 >> 7) * auVar111._56_8_;
              auVar111 = vaddpd_avx512f(auVar109,auVar112);
              auVar113 = vgatherqpd_avx512f(*(undefined8 *)((long)pcVar40 * 2 + 0x20));
              auVar114._8_8_ = (ulong)((byte)(uVar65 >> 1) & 1) * auVar113._8_8_;
              auVar114._0_8_ = (ulong)(bVar56 & 1) * auVar113._0_8_;
              auVar114._16_8_ = (ulong)((byte)(uVar65 >> 2) & 1) * auVar113._16_8_;
              auVar114._24_8_ = (ulong)((byte)(uVar65 >> 3) & 1) * auVar113._24_8_;
              auVar114._32_8_ = (ulong)((byte)(uVar65 >> 4) & 1) * auVar113._32_8_;
              auVar114._40_8_ = (ulong)((byte)(uVar65 >> 5) & 1) * auVar113._40_8_;
              auVar114._48_8_ = (ulong)((byte)(uVar65 >> 6) & 1) * auVar113._48_8_;
              auVar114._56_8_ = (uVar65 >> 7) * auVar113._56_8_;
              auVar67 = vxorpd_avx512vl(auVar112._0_16_,auVar112._0_16_);
              auVar112 = vsubpd_avx512f(auVar111,auVar116);
              auVar113 = vgatherqpd_avx512f(pcVar41->ey);
              auVar115._0_8_ =
                   (ulong)(bVar56 & 1) * auVar113._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar67._0_8_
              ;
              bVar57 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar115._8_8_ = (ulong)bVar57 * auVar113._8_8_ | (ulong)!bVar57 * auVar67._8_8_;
              auVar115._16_8_ = (ulong)((byte)(uVar65 >> 2) & 1) * auVar113._16_8_;
              auVar115._24_8_ = (ulong)((byte)(uVar65 >> 3) & 1) * auVar113._24_8_;
              auVar115._32_8_ = (ulong)((byte)(uVar65 >> 4) & 1) * auVar113._32_8_;
              auVar115._40_8_ = (ulong)((byte)(uVar65 >> 5) & 1) * auVar113._40_8_;
              auVar115._48_8_ = (ulong)((byte)(uVar65 >> 6) & 1) * auVar113._48_8_;
              auVar115._56_8_ = (uVar65 >> 7) * auVar113._56_8_;
              auVar113 = vsubpd_avx512f(auVar114,auVar115);
              auVar67 = vxorpd_avx512vl(auVar111._0_16_,auVar111._0_16_);
              auVar116 = vgatherqpd_avx512f(*(undefined8 *)((long)pcVar40 * 2 + 0x38));
              auVar71._0_8_ =
                   (ulong)(bVar56 & 1) * auVar116._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar67._0_8_
              ;
              bVar57 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar71._8_8_ = (ulong)bVar57 * auVar116._8_8_ | (ulong)!bVar57 * auVar67._8_8_;
              auVar111._16_8_ = (ulong)((byte)(uVar65 >> 2) & 1) * auVar116._16_8_;
              auVar111._0_16_ = auVar71;
              auVar111._24_8_ = (ulong)((byte)(uVar65 >> 3) & 1) * auVar116._24_8_;
              auVar111._32_8_ = (ulong)((byte)(uVar65 >> 4) & 1) * auVar116._32_8_;
              auVar111._40_8_ = (ulong)((byte)(uVar65 >> 5) & 1) * auVar116._40_8_;
              auVar111._48_8_ = (ulong)((byte)(uVar65 >> 6) & 1) * auVar116._48_8_;
              auVar111._56_8_ = (uVar65 >> 7) * auVar116._56_8_;
              auVar112 = vmulpd_avx512f(auVar94,auVar112);
              auVar111 = vsubpd_avx512f(auVar111,auVar114);
              auVar111 = vaddpd_avx512f(auVar115,auVar111);
              auVar67 = vxorpd_avx512vl(auVar71,auVar71);
              auVar116 = vgatherqpd_avx512f(*(undefined8 *)((long)pcVar40 * 2 + -0x10));
              auVar117._0_8_ =
                   (ulong)(bVar56 & 1) * auVar116._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar67._0_8_
              ;
              bVar57 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar117._8_8_ = (ulong)bVar57 * auVar116._8_8_ | (ulong)!bVar57 * auVar67._8_8_;
              auVar117._16_8_ = (ulong)((byte)(uVar65 >> 2) & 1) * auVar116._16_8_;
              auVar117._24_8_ = (ulong)((byte)(uVar65 >> 3) & 1) * auVar116._24_8_;
              auVar117._32_8_ = (ulong)((byte)(uVar65 >> 4) & 1) * auVar116._32_8_;
              auVar117._40_8_ = (ulong)((byte)(uVar65 >> 5) & 1) * auVar116._40_8_;
              auVar117._48_8_ = (ulong)((byte)(uVar65 >> 6) & 1) * auVar116._48_8_;
              auVar117._56_8_ = (uVar65 >> 7) * auVar116._56_8_;
              auVar112 = vfmadd231pd_avx512f(auVar112,auVar95,auVar110);
              auVar110 = vsubpd_avx512f(auVar111,auVar117);
              auVar110 = vmulpd_avx512f(auVar96,auVar110);
              auVar110 = vfmadd231pd_avx512f(auVar110,auVar97,auVar113);
              auVar110 = vmulpd_avx512f(auVar92,auVar110);
              auVar110 = vfmadd231pd_avx512f(auVar110,auVar98,auVar112);
              auVar67 = vxorpd_avx512vl(auVar113._0_16_,auVar113._0_16_);
              auVar111 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar40->ex + (long)&pcVar42->bx)
                                           );
              auVar118._0_8_ =
                   (ulong)(bVar56 & 1) * auVar111._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar67._0_8_
              ;
              bVar57 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar118._8_8_ = (ulong)bVar57 * auVar111._8_8_ | (ulong)!bVar57 * auVar67._8_8_;
              auVar118._16_8_ = (ulong)((byte)(uVar65 >> 2) & 1) * auVar111._16_8_;
              auVar118._24_8_ = (ulong)((byte)(uVar65 >> 3) & 1) * auVar111._24_8_;
              auVar118._32_8_ = (ulong)((byte)(uVar65 >> 4) & 1) * auVar111._32_8_;
              auVar118._40_8_ = (ulong)((byte)(uVar65 >> 5) & 1) * auVar111._40_8_;
              auVar118._48_8_ = (ulong)((byte)(uVar65 >> 6) & 1) * auVar111._48_8_;
              auVar118._56_8_ = (uVar65 >> 7) * auVar111._56_8_;
              auVar110 = vfmadd231pd_avx512f(auVar118,auVar89,auVar110);
              auVar111 = vpaddq_avx512f(auVar105,auVar108);
              vscatterqpd_avx512f(ZEXT864(pcVar42) + auVar92,uVar65,auVar110);
              auVar113 = vgatherqpd_avx512f(pcVar39->ez);
              auVar110._8_8_ = (ulong)((byte)(uVar65 >> 1) & 1) * auVar113._8_8_;
              auVar110._0_8_ = (ulong)(bVar56 & 1) * auVar113._0_8_;
              auVar110._16_8_ = (ulong)((byte)(uVar65 >> 2) & 1) * auVar113._16_8_;
              auVar110._24_8_ = (ulong)((byte)(uVar65 >> 3) & 1) * auVar113._24_8_;
              auVar110._32_8_ = (ulong)((byte)(uVar65 >> 4) & 1) * auVar113._32_8_;
              auVar110._40_8_ = (ulong)((byte)(uVar65 >> 5) & 1) * auVar113._40_8_;
              auVar110._48_8_ = (ulong)((byte)(uVar65 >> 6) & 1) * auVar113._48_8_;
              auVar110._56_8_ = (uVar65 >> 7) * auVar113._56_8_;
              vpaddq_avx512f(auVar106,auVar108);
              auVar113 = vsubpd_avx512f(auVar110,auVar109);
              auVar67 = vxorpd_avx512vl(auVar112._0_16_,auVar112._0_16_);
              auVar112 = vgatherqpd_avx512f(pcVar41->ez);
              auVar119._0_8_ =
                   (ulong)(bVar56 & 1) * auVar112._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar67._0_8_
              ;
              bVar57 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar119._8_8_ = (ulong)bVar57 * auVar112._8_8_ | (ulong)!bVar57 * auVar67._8_8_;
              auVar119._16_8_ = (ulong)((byte)(uVar65 >> 2) & 1) * auVar112._16_8_;
              auVar119._24_8_ = (ulong)((byte)(uVar65 >> 3) & 1) * auVar112._24_8_;
              auVar119._32_8_ = (ulong)((byte)(uVar65 >> 4) & 1) * auVar112._32_8_;
              auVar119._40_8_ = (ulong)((byte)(uVar65 >> 5) & 1) * auVar112._40_8_;
              auVar119._48_8_ = (ulong)((byte)(uVar65 >> 6) & 1) * auVar112._48_8_;
              auVar119._56_8_ = (uVar65 >> 7) * auVar112._56_8_;
              auVar112 = vsubpd_avx512f(auVar119,auVar110);
              in_ZMM28 = vpaddq_avx512f(in_ZMM23,auVar108);
              auVar112 = vaddpd_avx512f(auVar109,auVar112);
              auVar67 = vxorpd_avx512vl(auVar69,auVar69);
              auVar109 = vgatherqpd_avx512f(*(undefined8 *)(uVar64 + 0x10));
              auVar72._0_8_ =
                   (ulong)(bVar56 & 1) * auVar109._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar67._0_8_
              ;
              bVar57 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar72._8_8_ = (ulong)bVar57 * auVar109._8_8_ | (ulong)!bVar57 * auVar67._8_8_;
              auVar120._16_8_ = (ulong)((byte)(uVar65 >> 2) & 1) * auVar109._16_8_;
              auVar120._0_16_ = auVar72;
              auVar120._24_8_ = (ulong)((byte)(uVar65 >> 3) & 1) * auVar109._24_8_;
              auVar120._32_8_ = (ulong)((byte)(uVar65 >> 4) & 1) * auVar109._32_8_;
              auVar120._40_8_ = (ulong)((byte)(uVar65 >> 5) & 1) * auVar109._40_8_;
              auVar120._48_8_ = (ulong)((byte)(uVar65 >> 6) & 1) * auVar109._48_8_;
              auVar120._56_8_ = (uVar65 >> 7) * auVar109._56_8_;
              auVar86 = vmovdqa64_avx512f(auVar86);
              auVar90 = vmovdqa64_avx512f(auVar90);
              auVar87 = vmovdqa64_avx512f(auVar87);
              auVar109 = vgatherqpd_avx512f(*(undefined8 *)((long)pcVar40 * 2 + 0x18));
              auVar121._8_8_ = (ulong)((byte)(uVar65 >> 1) & 1) * auVar109._8_8_;
              auVar121._0_8_ = (ulong)(bVar56 & 1) * auVar109._0_8_;
              auVar121._16_8_ = (ulong)((byte)(uVar65 >> 2) & 1) * auVar109._16_8_;
              auVar121._24_8_ = (ulong)((byte)(uVar65 >> 3) & 1) * auVar109._24_8_;
              auVar121._32_8_ = (ulong)((byte)(uVar65 >> 4) & 1) * auVar109._32_8_;
              auVar121._40_8_ = (ulong)((byte)(uVar65 >> 5) & 1) * auVar109._40_8_;
              auVar121._48_8_ = (ulong)((byte)(uVar65 >> 6) & 1) * auVar109._48_8_;
              auVar121._56_8_ = (uVar65 >> 7) * auVar109._56_8_;
              auVar112 = vsubpd_avx512f(auVar112,auVar120);
              auVar67 = vxorpd_avx512vl(auVar72,auVar72);
              auVar109 = vgatherqpd_avx512f(*(undefined8 *)((long)pcVar40 * 2));
              in_ZMM30._0_8_ =
                   (ulong)(bVar56 & 1) * auVar109._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar67._0_8_
              ;
              bVar57 = (bool)((byte)(uVar65 >> 1) & 1);
              in_ZMM30._8_8_ = (ulong)bVar57 * auVar109._8_8_ | (ulong)!bVar57 * auVar67._8_8_;
              in_ZMM30._16_8_ = (ulong)((byte)(uVar65 >> 2) & 1) * auVar109._16_8_;
              in_ZMM30._24_8_ = (ulong)((byte)(uVar65 >> 3) & 1) * auVar109._24_8_;
              in_ZMM30._32_8_ = (ulong)((byte)(uVar65 >> 4) & 1) * auVar109._32_8_;
              in_ZMM30._40_8_ = (ulong)((byte)(uVar65 >> 5) & 1) * auVar109._40_8_;
              in_ZMM30._48_8_ = (ulong)((byte)(uVar65 >> 6) & 1) * auVar109._48_8_;
              in_ZMM30._56_8_ = (uVar65 >> 7) * auVar109._56_8_;
              auVar88 = vmovdqa64_avx512f(auVar88);
              auVar112 = vmulpd_avx512f(auVar99,auVar112);
              auVar109 = vgatherqpd_avx512f(*(undefined8 *)((long)pcVar40 * 2 + 0x30));
              auVar122._8_8_ = (ulong)((byte)(uVar65 >> 1) & 1) * auVar109._8_8_;
              auVar122._0_8_ = (ulong)(bVar56 & 1) * auVar109._0_8_;
              auVar122._16_8_ = (ulong)((byte)(uVar65 >> 2) & 1) * auVar109._16_8_;
              auVar122._24_8_ = (ulong)((byte)(uVar65 >> 3) & 1) * auVar109._24_8_;
              auVar122._32_8_ = (ulong)((byte)(uVar65 >> 4) & 1) * auVar109._32_8_;
              auVar122._40_8_ = (ulong)((byte)(uVar65 >> 5) & 1) * auVar109._40_8_;
              auVar122._48_8_ = (ulong)((byte)(uVar65 >> 6) & 1) * auVar109._48_8_;
              auVar122._56_8_ = (uVar65 >> 7) * auVar109._56_8_;
              auVar109 = vsubpd_avx512f(auVar122,auVar121);
              auVar110 = vsubpd_avx512f(auVar121,in_ZMM30);
              auVar109 = vaddpd_avx512f(in_ZMM30,auVar109);
              auVar112 = vfmadd231pd_avx512f(auVar112,auVar100,auVar113);
              auVar67 = vxorpd_avx512vl(auVar113._0_16_,auVar113._0_16_);
              auVar113 = vgatherqpd_avx512f(*(undefined8 *)((long)pcVar40 * 2 + -0x18));
              auVar73._0_8_ =
                   (ulong)(bVar56 & 1) * auVar113._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar67._0_8_
              ;
              bVar57 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar73._8_8_ = (ulong)bVar57 * auVar113._8_8_ | (ulong)!bVar57 * auVar67._8_8_;
              auVar123._16_8_ = (ulong)((byte)(uVar65 >> 2) & 1) * auVar113._16_8_;
              auVar123._0_16_ = auVar73;
              auVar123._24_8_ = (ulong)((byte)(uVar65 >> 3) & 1) * auVar113._24_8_;
              auVar123._32_8_ = (ulong)((byte)(uVar65 >> 4) & 1) * auVar113._32_8_;
              auVar123._40_8_ = (ulong)((byte)(uVar65 >> 5) & 1) * auVar113._40_8_;
              auVar123._48_8_ = (ulong)((byte)(uVar65 >> 6) & 1) * auVar113._48_8_;
              auVar123._56_8_ = (uVar65 >> 7) * auVar113._56_8_;
              auVar109 = vsubpd_avx512f(auVar109,auVar123);
              auVar109 = vmulpd_avx512f(auVar96,auVar109);
              auVar109 = vfmadd231pd_avx512f(auVar109,auVar97,auVar110);
              auVar110 = vpaddq_avx512f(auVar104,auVar108);
              auVar109 = vmulpd_avx512f(auVar109,auVar101);
              auVar112 = vfmadd231pd_avx512f(auVar109,auVar112,auVar93);
              auVar109 = vgatherqpd_avx512f(*(undefined8 *)(uVar62 + 8));
              auVar124._8_8_ = (ulong)((byte)(uVar65 >> 1) & 1) * auVar109._8_8_;
              auVar124._0_8_ = (ulong)(bVar56 & 1) * auVar109._0_8_;
              auVar124._16_8_ = (ulong)((byte)(uVar65 >> 2) & 1) * auVar109._16_8_;
              auVar124._24_8_ = (ulong)((byte)(uVar65 >> 3) & 1) * auVar109._24_8_;
              auVar124._32_8_ = (ulong)((byte)(uVar65 >> 4) & 1) * auVar109._32_8_;
              auVar124._40_8_ = (ulong)((byte)(uVar65 >> 5) & 1) * auVar109._40_8_;
              auVar124._48_8_ = (ulong)((byte)(uVar65 >> 6) & 1) * auVar109._48_8_;
              auVar124._56_8_ = (uVar65 >> 7) * auVar109._56_8_;
              auVar112 = vfmadd231pd_avx512f(auVar124,auVar89,auVar112);
              vscatterqpd_avx512f(ZEXT864(8) + auVar110,uVar65,auVar112);
              auVar112 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar40->ex + (long)&pcVar39->ex)
                                           );
              auVar125._8_8_ = (ulong)((byte)(uVar65 >> 1) & 1) * auVar112._8_8_;
              auVar125._0_8_ = (ulong)(bVar56 & 1) * auVar112._0_8_;
              auVar125._16_8_ = (ulong)((byte)(uVar65 >> 2) & 1) * auVar112._16_8_;
              auVar125._24_8_ = (ulong)((byte)(uVar65 >> 3) & 1) * auVar112._24_8_;
              auVar125._32_8_ = (ulong)((byte)(uVar65 >> 4) & 1) * auVar112._32_8_;
              auVar125._40_8_ = (ulong)((byte)(uVar65 >> 5) & 1) * auVar112._40_8_;
              auVar125._48_8_ = (ulong)((byte)(uVar65 >> 6) & 1) * auVar112._48_8_;
              auVar125._56_8_ = (uVar65 >> 7) * auVar112._56_8_;
              auVar112 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar40->ex + (long)&pcVar41->ex)
                                           );
              auVar126._8_8_ = (ulong)((byte)(uVar65 >> 1) & 1) * auVar112._8_8_;
              auVar126._0_8_ = (ulong)(bVar56 & 1) * auVar112._0_8_;
              auVar126._16_8_ = (ulong)((byte)(uVar65 >> 2) & 1) * auVar112._16_8_;
              auVar126._24_8_ = (ulong)((byte)(uVar65 >> 3) & 1) * auVar112._24_8_;
              auVar126._32_8_ = (ulong)((byte)(uVar65 >> 4) & 1) * auVar112._32_8_;
              auVar126._40_8_ = (ulong)((byte)(uVar65 >> 5) & 1) * auVar112._40_8_;
              auVar126._48_8_ = (ulong)((byte)(uVar65 >> 6) & 1) * auVar112._48_8_;
              auVar126._56_8_ = (uVar65 >> 7) * auVar112._56_8_;
              auVar67 = vxorpd_avx512vl(auVar73,auVar73);
              auVar112 = vgatherqpd_avx512f(*(undefined8 *)
                                             ((long)&pcVar40->ex + (long)&ppcVar38[uVar64 - 1]->ex))
              ;
              in_ZMM31._0_8_ =
                   (ulong)(bVar56 & 1) * auVar112._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar67._0_8_
              ;
              bVar57 = (bool)((byte)(uVar65 >> 1) & 1);
              in_ZMM31._8_8_ = (ulong)bVar57 * auVar112._8_8_ | (ulong)!bVar57 * auVar67._8_8_;
              in_ZMM31._16_8_ = (ulong)((byte)(uVar65 >> 2) & 1) * auVar112._16_8_;
              in_ZMM31._24_8_ = (ulong)((byte)(uVar65 >> 3) & 1) * auVar112._24_8_;
              in_ZMM31._32_8_ = (ulong)((byte)(uVar65 >> 4) & 1) * auVar112._32_8_;
              in_ZMM31._40_8_ = (ulong)((byte)(uVar65 >> 5) & 1) * auVar112._40_8_;
              in_ZMM31._48_8_ = (ulong)((byte)(uVar65 >> 6) & 1) * auVar112._48_8_;
              in_ZMM31._56_8_ = (uVar65 >> 7) * auVar112._56_8_;
              auVar67 = vxorpd_avx512vl(auVar108._0_16_,auVar108._0_16_);
              auVar112 = vgatherqpd_avx512f(pcVar39->ey);
              auVar108._0_8_ =
                   (ulong)(bVar56 & 1) * auVar112._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar67._0_8_
              ;
              bVar57 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar108._8_8_ = (ulong)bVar57 * auVar112._8_8_ | (ulong)!bVar57 * auVar67._8_8_;
              auVar108._16_8_ = (ulong)((byte)(uVar65 >> 2) & 1) * auVar112._16_8_;
              auVar108._24_8_ = (ulong)((byte)(uVar65 >> 3) & 1) * auVar112._24_8_;
              auVar108._32_8_ = (ulong)((byte)(uVar65 >> 4) & 1) * auVar112._32_8_;
              auVar108._40_8_ = (ulong)((byte)(uVar65 >> 5) & 1) * auVar112._40_8_;
              auVar108._48_8_ = (ulong)((byte)(uVar65 >> 6) & 1) * auVar112._48_8_;
              auVar108._56_8_ = (uVar65 >> 7) * auVar112._56_8_;
              auVar112 = vsubpd_avx512f(auVar126,auVar125);
              auVar109 = vsubpd_avx512f(auVar125,in_ZMM30);
              auVar112 = vaddpd_avx512f(in_ZMM30,auVar112);
              auVar67 = vxorpd_avx512vl(auVar111._0_16_,auVar111._0_16_);
              auVar111 = vgatherqpd_avx512f(pcVar41->ey);
              in_ZMM29._0_8_ =
                   (ulong)(bVar56 & 1) * auVar111._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar67._0_8_
              ;
              bVar57 = (bool)((byte)(uVar65 >> 1) & 1);
              in_ZMM29._8_8_ = (ulong)bVar57 * auVar111._8_8_ | (ulong)!bVar57 * auVar67._8_8_;
              in_ZMM29._16_8_ = (ulong)((byte)(uVar65 >> 2) & 1) * auVar111._16_8_;
              in_ZMM29._24_8_ = (ulong)((byte)(uVar65 >> 3) & 1) * auVar111._24_8_;
              in_ZMM29._32_8_ = (ulong)((byte)(uVar65 >> 4) & 1) * auVar111._32_8_;
              in_ZMM29._40_8_ = (ulong)((byte)(uVar65 >> 5) & 1) * auVar111._40_8_;
              in_ZMM29._48_8_ = (ulong)((byte)(uVar65 >> 6) & 1) * auVar111._48_8_;
              in_ZMM29._56_8_ = (uVar65 >> 7) * auVar111._56_8_;
              auVar111 = vsubpd_avx512f(in_ZMM29,auVar108);
              in_ZMM25 = vsubpd_avx512f(auVar108,auVar115);
              auVar108 = vaddpd_avx512f(auVar115,auVar111);
              auVar112 = vsubpd_avx512f(auVar112,in_ZMM31);
              auVar67 = vxorpd_avx512vl(auVar111._0_16_,auVar111._0_16_);
              auVar111 = vgatherqpd_avx512f(*(undefined8 *)(uVar64 + 8));
              in_ZMM27._0_8_ =
                   (ulong)(bVar56 & 1) * auVar111._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar67._0_8_
              ;
              bVar57 = (bool)((byte)(uVar65 >> 1) & 1);
              in_ZMM27._8_8_ = (ulong)bVar57 * auVar111._8_8_ | (ulong)!bVar57 * auVar67._8_8_;
              in_ZMM27._16_8_ = (ulong)((byte)(uVar65 >> 2) & 1) * auVar111._16_8_;
              in_ZMM27._24_8_ = (ulong)((byte)(uVar65 >> 3) & 1) * auVar111._24_8_;
              in_ZMM27._32_8_ = (ulong)((byte)(uVar65 >> 4) & 1) * auVar111._32_8_;
              in_ZMM27._40_8_ = (ulong)((byte)(uVar65 >> 5) & 1) * auVar111._40_8_;
              in_ZMM27._48_8_ = (ulong)((byte)(uVar65 >> 6) & 1) * auVar111._48_8_;
              in_ZMM27._56_8_ = (uVar65 >> 7) * auVar111._56_8_;
              in_ZMM26 = vsubpd_avx512f(auVar108,in_ZMM27);
              auVar108 = vmulpd_avx512f(auVar94,auVar112);
              auVar108 = vfmadd231pd_avx512f(auVar108,auVar95,auVar109);
              auVar112 = vmulpd_avx512f(auVar99,in_ZMM26);
              auVar112 = vfmadd231pd_avx512f(auVar112,auVar100,in_ZMM25);
              auVar112 = vmulpd_avx512f(auVar112,auVar102);
              auVar108 = vfmadd231pd_avx512f(auVar112,auVar91,auVar108);
              auVar112 = vgatherqpd_avx512f(*(undefined8 *)(uVar62 + 0x10));
              auVar127._8_8_ = (ulong)((byte)(uVar65 >> 1) & 1) * auVar112._8_8_;
              auVar127._0_8_ = (ulong)(bVar56 & 1) * auVar112._0_8_;
              auVar127._16_8_ = (ulong)((byte)(uVar65 >> 2) & 1) * auVar112._16_8_;
              auVar127._24_8_ = (ulong)((byte)(uVar65 >> 3) & 1) * auVar112._24_8_;
              auVar127._32_8_ = (ulong)((byte)(uVar65 >> 4) & 1) * auVar112._32_8_;
              auVar127._40_8_ = (ulong)((byte)(uVar65 >> 5) & 1) * auVar112._40_8_;
              auVar127._48_8_ = (ulong)((byte)(uVar65 >> 6) & 1) * auVar112._48_8_;
              auVar127._56_8_ = (uVar65 >> 7) * auVar112._56_8_;
              auVar108 = vfmadd231pd_avx512f(auVar127,auVar89,auVar108);
              vscatterqpd_avx512f(ZEXT864(0x10) + auVar110,uVar65,auVar108);
              auVar88 = vmovdqa64_avx512f(auVar88);
              auVar87 = vmovdqa64_avx512f(auVar87);
              auVar90 = vmovdqa64_avx512f(auVar90);
              auVar86 = vmovdqa64_avx512f(auVar86);
              uVar62 = uVar62 + 8;
              auVar107 = vpaddq_avx512f(auVar107,auVar90);
            } while (((ulong)(iVar36 - 2) + 6 & 0x1fffffff8) != uVar62);
          }
          uVar64 = uVar64 + 1;
        } while (uVar64 != iVar35 - 2);
      }
      uVar66 = uVar66 + 1;
    } while (uVar66 != uVar59);
  }
  uVar66 = (ulong)(iVar35 - 2U);
  if (3 < iVar35) {
    auVar13._8_8_ = 0;
    auVar13._0_8_ = (this->super_maxwell_solver).dtdy;
    auVar89 = vbroadcastsd_avx512f(auVar13);
    auVar174._0_8_ = auVar89._0_8_ ^ 0x8000000000000000;
    auVar174._8_8_ = auVar89._8_8_ ^ 0x8000000000000000;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = (this->super_maxwell_solver).dtdz;
    auVar88 = vbroadcastsd_avx512f(auVar14);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = (this->super_maxwell_solver).dtdx;
    auVar87 = vbroadcastsd_avx512f(auVar15);
    auVar177._0_8_ = auVar88._0_8_ ^ 0x8000000000000000;
    auVar177._8_8_ = auVar88._8_8_ ^ 0x8000000000000000;
    auVar179._0_8_ = auVar87._0_8_ ^ 0x8000000000000000;
    auVar179._8_8_ = auVar87._8_8_ ^ 0x8000000000000000;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = this->ay;
    auVar90 = vbroadcastsd_avx512f(auVar16);
    auVar17._8_8_ = 0;
    auVar17._0_8_ = this->by;
    auVar86 = vbroadcastsd_avx512f(auVar17);
    auVar18._8_8_ = 0;
    auVar18._0_8_ = this->az;
    auVar91 = vbroadcastsd_avx512f(auVar18);
    auVar19._8_8_ = 0;
    auVar19._0_8_ = this->bz;
    auVar92 = vbroadcastsd_avx512f(auVar19);
    auVar20._8_8_ = 0;
    auVar20._0_8_ = this->ax;
    auVar93 = vbroadcastsd_avx512f(auVar20);
    auVar21._8_8_ = 0;
    auVar21._0_8_ = this->bx;
    auVar94 = vbroadcastsd_avx512f(auVar21);
    auVar95 = vpbroadcastq_avx512f();
    auVar96 = vbroadcastsd_avx512f(auVar174);
    auVar97 = vbroadcastsd_avx512f(auVar177);
    auVar98 = vbroadcastsd_avx512f(auVar179);
    uVar64 = 1;
    auVar99 = vpmovsxbq_avx512f(ZEXT816(0x807060504030201));
    auVar100 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar101 = vpbroadcastq_avx512f(ZEXT816(0x18));
    auVar102 = vbroadcastsd_avx512f(ZEXT816(0x3fe0000000000000));
    auVar103 = vpbroadcastq_avx512f(ZEXT816(8));
    do {
      if (3 < iVar36) {
        ppcVar38 = (((this->super_maxwell_solver).ce)->p)._M_t.
                   super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                   super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                   super__Head_base<0UL,_celle_***,_false>._M_head_impl[lVar61 + -1];
        pcVar39 = ppcVar38[uVar64];
        pcVar42 = (pfVar37->p)._M_t.
                  super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                  super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                  super__Head_base<0UL,_cellb_***,_false>._M_head_impl[lVar61 + -1][uVar64];
        auVar104 = vpbroadcastq_avx512f();
        auVar105 = vpbroadcastq_avx512f();
        auVar106 = vpbroadcastq_avx512f();
        uVar62 = 0;
        auVar107 = vmovdqa64_avx512f(auVar99);
        do {
          auVar108 = vpbroadcastq_avx512f();
          auVar108 = vporq_avx512f(auVar108,auVar100);
          uVar65 = vpcmpuq_avx512f(auVar108,auVar95,2);
          auVar108 = vpmullq_avx512dq(auVar107,auVar101);
          auVar74 = vpxord_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
          auVar112 = vgatherqpd_avx512f(*(undefined8 *)((long)&ppcVar38[uVar64 + 1]->ez + lVar63));
          bVar56 = (byte)uVar65;
          auVar128._0_8_ =
               (ulong)(bVar56 & 1) * auVar112._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar74._0_8_;
          bVar57 = (bool)((byte)(uVar65 >> 1) & 1);
          auVar128._8_8_ = (ulong)bVar57 * auVar112._8_8_ | (ulong)!bVar57 * auVar74._8_8_;
          auVar128._16_8_ = (ulong)((byte)(uVar65 >> 2) & 1) * auVar112._16_8_;
          auVar128._24_8_ = (ulong)((byte)(uVar65 >> 3) & 1) * auVar112._24_8_;
          auVar128._32_8_ = (ulong)((byte)(uVar65 >> 4) & 1) * auVar112._32_8_;
          auVar128._40_8_ = (ulong)((byte)(uVar65 >> 5) & 1) * auVar112._40_8_;
          auVar128._48_8_ = (ulong)((byte)(uVar65 >> 6) & 1) * auVar112._48_8_;
          auVar128._56_8_ = (uVar65 >> 7) * auVar112._56_8_;
          vpaddq_avx512f(auVar104,auVar108);
          auVar74 = vxorpd_avx512vl(in_ZMM25._0_16_,in_ZMM25._0_16_);
          auVar112 = vgatherqpd_avx512f(*(undefined8 *)(uVar64 + 0x10));
          auVar129._0_8_ =
               (ulong)(bVar56 & 1) * auVar112._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar74._0_8_;
          bVar57 = (bool)((byte)(uVar65 >> 1) & 1);
          auVar129._8_8_ = (ulong)bVar57 * auVar112._8_8_ | (ulong)!bVar57 * auVar74._8_8_;
          auVar129._16_8_ = (ulong)((byte)(uVar65 >> 2) & 1) * auVar112._16_8_;
          auVar129._24_8_ = (ulong)((byte)(uVar65 >> 3) & 1) * auVar112._24_8_;
          auVar129._32_8_ = (ulong)((byte)(uVar65 >> 4) & 1) * auVar112._32_8_;
          auVar129._40_8_ = (ulong)((byte)(uVar65 >> 5) & 1) * auVar112._40_8_;
          auVar129._48_8_ = (ulong)((byte)(uVar65 >> 6) & 1) * auVar112._48_8_;
          auVar129._56_8_ = (uVar65 >> 7) * auVar112._56_8_;
          auVar112 = vsubpd_avx512f(auVar128,auVar129);
          auVar74 = vxorpd_avx512vl(in_ZMM27._0_16_,in_ZMM27._0_16_);
          auVar109 = vgatherqpd_avx512f(*(undefined8 *)((long)&ppcVar38[uVar64 + 2]->ez + lVar63));
          auVar75._0_8_ =
               (ulong)(bVar56 & 1) * auVar109._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar74._0_8_;
          bVar57 = (bool)((byte)(uVar65 >> 1) & 1);
          auVar75._8_8_ = (ulong)bVar57 * auVar109._8_8_ | (ulong)!bVar57 * auVar74._8_8_;
          auVar130._16_8_ = (ulong)((byte)(uVar65 >> 2) & 1) * auVar109._16_8_;
          auVar130._0_16_ = auVar75;
          auVar130._24_8_ = (ulong)((byte)(uVar65 >> 3) & 1) * auVar109._24_8_;
          auVar130._32_8_ = (ulong)((byte)(uVar65 >> 4) & 1) * auVar109._32_8_;
          auVar130._40_8_ = (ulong)((byte)(uVar65 >> 5) & 1) * auVar109._40_8_;
          auVar130._48_8_ = (ulong)((byte)(uVar65 >> 6) & 1) * auVar109._48_8_;
          auVar130._56_8_ = (uVar65 >> 7) * auVar109._56_8_;
          auVar109 = vsubpd_avx512f(auVar130,auVar128);
          auVar109 = vaddpd_avx512f(auVar129,auVar109);
          auVar74 = vxorpd_avx512vl(auVar75,auVar75);
          auVar110 = vgatherqpd_avx512f(*(undefined8 *)((long)&ppcVar38[uVar64 - 1]->ez + lVar63));
          auVar131._0_8_ =
               (ulong)(bVar56 & 1) * auVar110._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar74._0_8_;
          bVar57 = (bool)((byte)(uVar65 >> 1) & 1);
          auVar131._8_8_ = (ulong)bVar57 * auVar110._8_8_ | (ulong)!bVar57 * auVar74._8_8_;
          auVar131._16_8_ = (ulong)((byte)(uVar65 >> 2) & 1) * auVar110._16_8_;
          auVar131._24_8_ = (ulong)((byte)(uVar65 >> 3) & 1) * auVar110._24_8_;
          auVar131._32_8_ = (ulong)((byte)(uVar65 >> 4) & 1) * auVar110._32_8_;
          auVar131._40_8_ = (ulong)((byte)(uVar65 >> 5) & 1) * auVar110._40_8_;
          auVar131._48_8_ = (ulong)((byte)(uVar65 >> 6) & 1) * auVar110._48_8_;
          auVar131._56_8_ = (uVar65 >> 7) * auVar110._56_8_;
          auVar74 = vxorpd_avx512vl(in_ZMM28._0_16_,in_ZMM28._0_16_);
          auVar110 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar39[1].ey + lVar63));
          auVar132._0_8_ =
               (ulong)(bVar56 & 1) * auVar110._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar74._0_8_;
          bVar57 = (bool)((byte)(uVar65 >> 1) & 1);
          auVar132._8_8_ = (ulong)bVar57 * auVar110._8_8_ | (ulong)!bVar57 * auVar74._8_8_;
          auVar132._16_8_ = (ulong)((byte)(uVar65 >> 2) & 1) * auVar110._16_8_;
          auVar132._24_8_ = (ulong)((byte)(uVar65 >> 3) & 1) * auVar110._24_8_;
          auVar132._32_8_ = (ulong)((byte)(uVar65 >> 4) & 1) * auVar110._32_8_;
          auVar132._40_8_ = (ulong)((byte)(uVar65 >> 5) & 1) * auVar110._40_8_;
          auVar132._48_8_ = (ulong)((byte)(uVar65 >> 6) & 1) * auVar110._48_8_;
          auVar132._56_8_ = (uVar65 >> 7) * auVar110._56_8_;
          auVar110 = vsubpd_avx512f(auVar109,auVar131);
          auVar74 = vxorpd_avx512vl(auVar109._0_16_,auVar109._0_16_);
          auVar109 = vgatherqpd_avx512f(*(undefined8 *)(uVar64 + 8));
          auVar133._0_8_ =
               (ulong)(bVar56 & 1) * auVar109._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar74._0_8_;
          bVar57 = (bool)((byte)(uVar65 >> 1) & 1);
          auVar133._8_8_ = (ulong)bVar57 * auVar109._8_8_ | (ulong)!bVar57 * auVar74._8_8_;
          auVar133._16_8_ = (ulong)((byte)(uVar65 >> 2) & 1) * auVar109._16_8_;
          auVar133._24_8_ = (ulong)((byte)(uVar65 >> 3) & 1) * auVar109._24_8_;
          auVar133._32_8_ = (ulong)((byte)(uVar65 >> 4) & 1) * auVar109._32_8_;
          auVar133._40_8_ = (ulong)((byte)(uVar65 >> 5) & 1) * auVar109._40_8_;
          auVar133._48_8_ = (ulong)((byte)(uVar65 >> 6) & 1) * auVar109._48_8_;
          auVar133._56_8_ = (uVar65 >> 7) * auVar109._56_8_;
          auVar109 = vsubpd_avx512f(auVar132,auVar133);
          auVar110 = vmulpd_avx512f(auVar90,auVar110);
          auVar74 = vxorpd_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
          auVar111 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar39[2].ey + lVar63));
          auVar76._0_8_ =
               (ulong)(bVar56 & 1) * auVar111._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar74._0_8_;
          bVar57 = (bool)((byte)(uVar65 >> 1) & 1);
          auVar76._8_8_ = (ulong)bVar57 * auVar111._8_8_ | (ulong)!bVar57 * auVar74._8_8_;
          auVar134._16_8_ = (ulong)((byte)(uVar65 >> 2) & 1) * auVar111._16_8_;
          auVar134._0_16_ = auVar76;
          auVar134._24_8_ = (ulong)((byte)(uVar65 >> 3) & 1) * auVar111._24_8_;
          auVar134._32_8_ = (ulong)((byte)(uVar65 >> 4) & 1) * auVar111._32_8_;
          auVar134._40_8_ = (ulong)((byte)(uVar65 >> 5) & 1) * auVar111._40_8_;
          auVar134._48_8_ = (ulong)((byte)(uVar65 >> 6) & 1) * auVar111._48_8_;
          auVar134._56_8_ = (uVar65 >> 7) * auVar111._56_8_;
          auVar111 = vsubpd_avx512f(auVar134,auVar132);
          auVar111 = vaddpd_avx512f(auVar133,auVar111);
          auVar110 = vfmadd231pd_avx512f(auVar110,auVar86,auVar112);
          auVar74 = vxorpd_avx512vl(auVar112._0_16_,auVar112._0_16_);
          auVar112 = vgatherqpd_avx512f(*(undefined8 *)((long)pcVar39 + lVar63 + -0x10));
          auVar135._0_8_ =
               (ulong)(bVar56 & 1) * auVar112._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar74._0_8_;
          bVar57 = (bool)((byte)(uVar65 >> 1) & 1);
          auVar135._8_8_ = (ulong)bVar57 * auVar112._8_8_ | (ulong)!bVar57 * auVar74._8_8_;
          auVar135._16_8_ = (ulong)((byte)(uVar65 >> 2) & 1) * auVar112._16_8_;
          auVar135._24_8_ = (ulong)((byte)(uVar65 >> 3) & 1) * auVar112._24_8_;
          auVar135._32_8_ = (ulong)((byte)(uVar65 >> 4) & 1) * auVar112._32_8_;
          auVar135._40_8_ = (ulong)((byte)(uVar65 >> 5) & 1) * auVar112._40_8_;
          auVar135._48_8_ = (ulong)((byte)(uVar65 >> 6) & 1) * auVar112._48_8_;
          auVar135._56_8_ = (uVar65 >> 7) * auVar112._56_8_;
          auVar112 = vsubpd_avx512f(auVar111,auVar135);
          auVar112 = vmulpd_avx512f(auVar91,auVar112);
          auVar112 = vfmadd231pd_avx512f(auVar112,auVar92,auVar109);
          auVar109 = vmulpd_avx512f(auVar88,auVar112);
          auVar109 = vfmadd231pd_avx512f(auVar109,auVar96,auVar110);
          auVar74 = vxorpd_avx512vl(auVar112._0_16_,auVar112._0_16_);
          auVar112 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar42->bx + lVar63));
          auVar136._0_8_ =
               (ulong)(bVar56 & 1) * auVar112._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar74._0_8_;
          bVar57 = (bool)((byte)(uVar65 >> 1) & 1);
          auVar136._8_8_ = (ulong)bVar57 * auVar112._8_8_ | (ulong)!bVar57 * auVar74._8_8_;
          auVar136._16_8_ = (ulong)((byte)(uVar65 >> 2) & 1) * auVar112._16_8_;
          auVar136._24_8_ = (ulong)((byte)(uVar65 >> 3) & 1) * auVar112._24_8_;
          auVar136._32_8_ = (ulong)((byte)(uVar65 >> 4) & 1) * auVar112._32_8_;
          auVar136._40_8_ = (ulong)((byte)(uVar65 >> 5) & 1) * auVar112._40_8_;
          auVar136._48_8_ = (ulong)((byte)(uVar65 >> 6) & 1) * auVar112._48_8_;
          auVar136._56_8_ = (uVar65 >> 7) * auVar112._56_8_;
          auVar112 = vfmadd231pd_avx512f(auVar136,auVar102,auVar109);
          vpaddq_avx512f(auVar105,auVar108);
          vscatterqpd_avx512f(ZEXT864(pcVar42) + ZEXT864(0) + auVar92,uVar65,auVar112);
          vpaddq_avx512f(auVar106,auVar108);
          auVar74 = vxorpd_avx512vl(auVar110._0_16_,auVar110._0_16_);
          auVar108 = vgatherqpd_avx512f(*(undefined8 *)(uVar66 + 0x10));
          auVar137._0_8_ =
               (ulong)(bVar56 & 1) * auVar108._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar74._0_8_;
          bVar57 = (bool)((byte)(uVar65 >> 1) & 1);
          auVar137._8_8_ = (ulong)bVar57 * auVar108._8_8_ | (ulong)!bVar57 * auVar74._8_8_;
          auVar137._16_8_ = (ulong)((byte)(uVar65 >> 2) & 1) * auVar108._16_8_;
          auVar137._24_8_ = (ulong)((byte)(uVar65 >> 3) & 1) * auVar108._24_8_;
          auVar137._32_8_ = (ulong)((byte)(uVar65 >> 4) & 1) * auVar108._32_8_;
          auVar137._40_8_ = (ulong)((byte)(uVar65 >> 5) & 1) * auVar108._40_8_;
          auVar137._48_8_ = (ulong)((byte)(uVar65 >> 6) & 1) * auVar108._48_8_;
          auVar137._56_8_ = (uVar65 >> 7) * auVar108._56_8_;
          auVar74 = vxorpd_avx512vl(auVar111._0_16_,auVar111._0_16_);
          auVar108 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar39[1].ex + lVar63));
          auVar138._0_8_ =
               (ulong)(bVar56 & 1) * auVar108._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar74._0_8_;
          bVar57 = (bool)((byte)(uVar65 >> 1) & 1);
          auVar138._8_8_ = (ulong)bVar57 * auVar108._8_8_ | (ulong)!bVar57 * auVar74._8_8_;
          auVar138._16_8_ = (ulong)((byte)(uVar65 >> 2) & 1) * auVar108._16_8_;
          auVar138._24_8_ = (ulong)((byte)(uVar65 >> 3) & 1) * auVar108._24_8_;
          auVar138._32_8_ = (ulong)((byte)(uVar65 >> 4) & 1) * auVar108._32_8_;
          auVar138._40_8_ = (ulong)((byte)(uVar65 >> 5) & 1) * auVar108._40_8_;
          auVar138._48_8_ = (ulong)((byte)(uVar65 >> 6) & 1) * auVar108._48_8_;
          auVar138._56_8_ = (uVar65 >> 7) * auVar108._56_8_;
          auVar74 = vxorpd_avx512vl(auVar76,auVar76);
          auVar108 = vsubpd_avx512f(auVar129,auVar137);
          auVar112 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar39->ex + lVar63));
          in_ZMM29._0_8_ =
               (ulong)(bVar56 & 1) * auVar112._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar74._0_8_;
          bVar57 = (bool)((byte)(uVar65 >> 1) & 1);
          in_ZMM29._8_8_ = (ulong)bVar57 * auVar112._8_8_ | (ulong)!bVar57 * auVar74._8_8_;
          in_ZMM29._16_8_ = (ulong)((byte)(uVar65 >> 2) & 1) * auVar112._16_8_;
          in_ZMM29._24_8_ = (ulong)((byte)(uVar65 >> 3) & 1) * auVar112._24_8_;
          in_ZMM29._32_8_ = (ulong)((byte)(uVar65 >> 4) & 1) * auVar112._32_8_;
          in_ZMM29._40_8_ = (ulong)((byte)(uVar65 >> 5) & 1) * auVar112._40_8_;
          in_ZMM29._48_8_ = (ulong)((byte)(uVar65 >> 6) & 1) * auVar112._48_8_;
          in_ZMM29._56_8_ = (uVar65 >> 7) * auVar112._56_8_;
          in_ZMM30 = vsubpd_avx512f(auVar138,in_ZMM29);
          auVar74 = vxorpd_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
          auVar112 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar39[2].ex + lVar63));
          auVar77._0_8_ =
               (ulong)(bVar56 & 1) * auVar112._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar74._0_8_;
          bVar57 = (bool)((byte)(uVar65 >> 1) & 1);
          auVar77._8_8_ = (ulong)bVar57 * auVar112._8_8_ | (ulong)!bVar57 * auVar74._8_8_;
          auVar139._16_8_ = (ulong)((byte)(uVar65 >> 2) & 1) * auVar112._16_8_;
          auVar139._0_16_ = auVar77;
          auVar139._24_8_ = (ulong)((byte)(uVar65 >> 3) & 1) * auVar112._24_8_;
          auVar139._32_8_ = (ulong)((byte)(uVar65 >> 4) & 1) * auVar112._32_8_;
          auVar139._40_8_ = (ulong)((byte)(uVar65 >> 5) & 1) * auVar112._40_8_;
          auVar139._48_8_ = (ulong)((byte)(uVar65 >> 6) & 1) * auVar112._48_8_;
          auVar139._56_8_ = (uVar65 >> 7) * auVar112._56_8_;
          auVar108 = vmulpd_avx512f(auVar93,auVar108);
          auVar112 = vsubpd_avx512f(auVar139,auVar138);
          auVar112 = vaddpd_avx512f(in_ZMM29,auVar112);
          auVar74 = vxorpd_avx512vl(auVar77,auVar77);
          auVar109 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar39[-1].ex + lVar63));
          in_ZMM31._0_8_ =
               (ulong)(bVar56 & 1) * auVar109._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar74._0_8_;
          bVar57 = (bool)((byte)(uVar65 >> 1) & 1);
          in_ZMM31._8_8_ = (ulong)bVar57 * auVar109._8_8_ | (ulong)!bVar57 * auVar74._8_8_;
          in_ZMM31._16_8_ = (ulong)((byte)(uVar65 >> 2) & 1) * auVar109._16_8_;
          in_ZMM31._24_8_ = (ulong)((byte)(uVar65 >> 3) & 1) * auVar109._24_8_;
          in_ZMM31._32_8_ = (ulong)((byte)(uVar65 >> 4) & 1) * auVar109._32_8_;
          in_ZMM31._40_8_ = (ulong)((byte)(uVar65 >> 5) & 1) * auVar109._40_8_;
          in_ZMM31._48_8_ = (ulong)((byte)(uVar65 >> 6) & 1) * auVar109._48_8_;
          in_ZMM31._56_8_ = (uVar65 >> 7) * auVar109._56_8_;
          auVar108 = vfnmadd231pd_avx512f(auVar108,auVar94,auVar129);
          auVar112 = vsubpd_avx512f(auVar112,in_ZMM31);
          auVar112 = vmulpd_avx512f(auVar91,auVar112);
          auVar112 = vfmadd231pd_avx512f(auVar112,auVar92,in_ZMM30);
          auVar112 = vmulpd_avx512f(auVar112,auVar97);
          auVar112 = vfmadd231pd_avx512f(auVar112,auVar87,auVar108);
          auVar74 = vxorpd_avx512vl(auVar108._0_16_,auVar108._0_16_);
          auVar108 = vgatherqpd_avx512f(*(undefined8 *)(uVar64 + 8));
          auVar140._0_8_ =
               (ulong)(bVar56 & 1) * auVar108._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar74._0_8_;
          bVar57 = (bool)((byte)(uVar65 >> 1) & 1);
          auVar140._8_8_ = (ulong)bVar57 * auVar108._8_8_ | (ulong)!bVar57 * auVar74._8_8_;
          auVar140._16_8_ = (ulong)((byte)(uVar65 >> 2) & 1) * auVar108._16_8_;
          auVar140._24_8_ = (ulong)((byte)(uVar65 >> 3) & 1) * auVar108._24_8_;
          auVar140._32_8_ = (ulong)((byte)(uVar65 >> 4) & 1) * auVar108._32_8_;
          auVar140._40_8_ = (ulong)((byte)(uVar65 >> 5) & 1) * auVar108._40_8_;
          auVar140._48_8_ = (ulong)((byte)(uVar65 >> 6) & 1) * auVar108._48_8_;
          auVar140._56_8_ = (uVar65 >> 7) * auVar108._56_8_;
          auVar108 = vfmadd231pd_avx512f(auVar140,auVar102,auVar112);
          vscatterqpd_avx512f(ZEXT864(8) + auVar94,uVar65,auVar108);
          auVar74 = vxorpd_avx512vl(auVar112._0_16_,auVar112._0_16_);
          auVar112 = vgatherqpd_avx512f(*(undefined8 *)((long)&ppcVar38[uVar64 + 1]->ex + lVar63));
          auVar141._0_8_ =
               (ulong)(bVar56 & 1) * auVar112._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar74._0_8_;
          bVar57 = (bool)((byte)(uVar65 >> 1) & 1);
          auVar141._8_8_ = (ulong)bVar57 * auVar112._8_8_ | (ulong)!bVar57 * auVar74._8_8_;
          auVar141._16_8_ = (ulong)((byte)(uVar65 >> 2) & 1) * auVar112._16_8_;
          auVar141._24_8_ = (ulong)((byte)(uVar65 >> 3) & 1) * auVar112._24_8_;
          auVar141._32_8_ = (ulong)((byte)(uVar65 >> 4) & 1) * auVar112._32_8_;
          auVar141._40_8_ = (ulong)((byte)(uVar65 >> 5) & 1) * auVar112._40_8_;
          auVar141._48_8_ = (ulong)((byte)(uVar65 >> 6) & 1) * auVar112._48_8_;
          auVar141._56_8_ = (uVar65 >> 7) * auVar112._56_8_;
          auVar74 = vxorpd_avx512vl(auVar108._0_16_,auVar108._0_16_);
          auVar108 = vgatherqpd_avx512f(*(undefined8 *)((long)&ppcVar38[uVar64 + 2]->ex + lVar63));
          auVar78._0_8_ =
               (ulong)(bVar56 & 1) * auVar108._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar74._0_8_;
          bVar57 = (bool)((byte)(uVar65 >> 1) & 1);
          auVar78._8_8_ = (ulong)bVar57 * auVar108._8_8_ | (ulong)!bVar57 * auVar74._8_8_;
          auVar142._16_8_ = (ulong)((byte)(uVar65 >> 2) & 1) * auVar108._16_8_;
          auVar142._0_16_ = auVar78;
          auVar142._24_8_ = (ulong)((byte)(uVar65 >> 3) & 1) * auVar108._24_8_;
          auVar142._32_8_ = (ulong)((byte)(uVar65 >> 4) & 1) * auVar108._32_8_;
          auVar142._40_8_ = (ulong)((byte)(uVar65 >> 5) & 1) * auVar108._40_8_;
          auVar142._48_8_ = (ulong)((byte)(uVar65 >> 6) & 1) * auVar108._48_8_;
          auVar142._56_8_ = (uVar65 >> 7) * auVar108._56_8_;
          in_ZMM28 = vsubpd_avx512f(auVar141,in_ZMM29);
          auVar108 = vsubpd_avx512f(auVar142,auVar141);
          auVar108 = vaddpd_avx512f(in_ZMM29,auVar108);
          auVar74 = vxorpd_avx512vl(auVar78,auVar78);
          auVar112 = vgatherqpd_avx512f(*(undefined8 *)((long)&ppcVar38[uVar64 - 1]->ex + lVar63));
          in_ZMM27._0_8_ =
               (ulong)(bVar56 & 1) * auVar112._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar74._0_8_;
          bVar57 = (bool)((byte)(uVar65 >> 1) & 1);
          in_ZMM27._8_8_ = (ulong)bVar57 * auVar112._8_8_ | (ulong)!bVar57 * auVar74._8_8_;
          in_ZMM27._16_8_ = (ulong)((byte)(uVar65 >> 2) & 1) * auVar112._16_8_;
          in_ZMM27._24_8_ = (ulong)((byte)(uVar65 >> 3) & 1) * auVar112._24_8_;
          in_ZMM27._32_8_ = (ulong)((byte)(uVar65 >> 4) & 1) * auVar112._32_8_;
          in_ZMM27._40_8_ = (ulong)((byte)(uVar65 >> 5) & 1) * auVar112._40_8_;
          in_ZMM27._48_8_ = (ulong)((byte)(uVar65 >> 6) & 1) * auVar112._48_8_;
          in_ZMM27._56_8_ = (uVar65 >> 7) * auVar112._56_8_;
          auVar112 = vsubpd_avx512f(auVar108,in_ZMM27);
          auVar112 = vmulpd_avx512f(auVar90,auVar112);
          auVar74 = vxorpd_avx512vl(auVar108._0_16_,auVar108._0_16_);
          auVar108 = vgatherqpd_avx512f(*(undefined8 *)(uVar66 + 8));
          auVar143._0_8_ =
               (ulong)(bVar56 & 1) * auVar108._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar74._0_8_;
          bVar57 = (bool)((byte)(uVar65 >> 1) & 1);
          auVar143._8_8_ = (ulong)bVar57 * auVar108._8_8_ | (ulong)!bVar57 * auVar74._8_8_;
          auVar143._16_8_ = (ulong)((byte)(uVar65 >> 2) & 1) * auVar108._16_8_;
          auVar143._24_8_ = (ulong)((byte)(uVar65 >> 3) & 1) * auVar108._24_8_;
          auVar143._32_8_ = (ulong)((byte)(uVar65 >> 4) & 1) * auVar108._32_8_;
          auVar143._40_8_ = (ulong)((byte)(uVar65 >> 5) & 1) * auVar108._40_8_;
          auVar143._48_8_ = (ulong)((byte)(uVar65 >> 6) & 1) * auVar108._48_8_;
          auVar143._56_8_ = (uVar65 >> 7) * auVar108._56_8_;
          auVar108 = vsubpd_avx512f(auVar133,auVar143);
          auVar112 = vfmadd231pd_avx512f(auVar112,auVar86,in_ZMM28);
          auVar108 = vmulpd_avx512f(auVar93,auVar108);
          auVar108 = vfnmadd231pd_avx512f(auVar108,auVar94,auVar133);
          auVar109 = vmulpd_avx512f(auVar108,auVar98);
          auVar74 = vxorpd_avx512vl(auVar108._0_16_,auVar108._0_16_);
          in_ZMM23 = vfmadd231pd_avx512f(auVar109,auVar89,auVar112);
          auVar108 = vgatherqpd_avx512f(*(undefined8 *)(uVar64 + 0x10));
          auVar144._0_8_ =
               (ulong)(bVar56 & 1) * auVar108._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar74._0_8_;
          bVar57 = (bool)((byte)(uVar65 >> 1) & 1);
          auVar144._8_8_ = (ulong)bVar57 * auVar108._8_8_ | (ulong)!bVar57 * auVar74._8_8_;
          auVar144._16_8_ = (ulong)((byte)(uVar65 >> 2) & 1) * auVar108._16_8_;
          auVar144._24_8_ = (ulong)((byte)(uVar65 >> 3) & 1) * auVar108._24_8_;
          auVar144._32_8_ = (ulong)((byte)(uVar65 >> 4) & 1) * auVar108._32_8_;
          auVar144._40_8_ = (ulong)((byte)(uVar65 >> 5) & 1) * auVar108._40_8_;
          auVar144._48_8_ = (ulong)((byte)(uVar65 >> 6) & 1) * auVar108._48_8_;
          auVar144._56_8_ = (uVar65 >> 7) * auVar108._56_8_;
          in_ZMM25 = vfmadd231pd_avx512f(auVar144,auVar102,in_ZMM23);
          vscatterqpd_avx512f(ZEXT864(0x10) + auVar94,uVar65,in_ZMM25);
          uVar62 = uVar62 + 8;
          auVar107 = vpaddq_avx512f(auVar107,auVar103);
        } while (((ulong)(iVar36 - 2) + 6 & 0x1fffffff8) != uVar62);
      }
      uVar64 = uVar64 + 1;
    } while (uVar64 != uVar66);
  }
  if (3 < iVar34) {
    auVar166._8_8_ = 0x8000000000000000;
    auVar166._0_8_ = 0x8000000000000000;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = (this->super_maxwell_solver).dtdy;
    auVar89 = vbroadcastsd_avx512f(auVar22);
    auVar175._0_8_ = auVar89._0_8_ ^ 0x8000000000000000;
    auVar175._8_8_ = auVar89._8_8_ ^ 0x8000000000000000;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = (this->super_maxwell_solver).dtdz;
    auVar88 = vbroadcastsd_avx512f(auVar23);
    auVar24._8_8_ = 0;
    auVar24._0_8_ = (this->super_maxwell_solver).dtdx;
    auVar87 = vbroadcastsd_avx512f(auVar24);
    auVar178._0_8_ = auVar88._0_8_ ^ 0x8000000000000000;
    auVar178._8_8_ = auVar88._8_8_ ^ 0x8000000000000000;
    auVar67 = auVar87._0_16_;
    auVar74 = vxorpd_avx512vl(auVar67,auVar166);
    uVar62 = (ulong)(iVar36 - 2) + 6 & 0x1fffffff8;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = this->ay;
    auVar90 = vbroadcastsd_avx512f(auVar25);
    auVar26._8_8_ = 0;
    auVar26._0_8_ = this->by;
    auVar86 = vbroadcastsd_avx512f(auVar26);
    auVar27._8_8_ = 0;
    auVar27._0_8_ = this->az;
    auVar91 = vbroadcastsd_avx512f(auVar27);
    auVar28._8_8_ = 0;
    auVar28._0_8_ = this->bz;
    auVar92 = vbroadcastsd_avx512f(auVar28);
    auVar29._8_8_ = 0;
    auVar29._0_8_ = this->ax;
    auVar93 = vbroadcastsd_avx512f(auVar29);
    auVar30._8_8_ = 0;
    auVar30._0_8_ = this->bx;
    auVar94 = vbroadcastsd_avx512f(auVar30);
    auVar102 = vpbroadcastq_avx512f();
    auVar95 = vbroadcastsd_avx512f(auVar175);
    auVar96 = vbroadcastsd_avx512f(auVar178);
    auVar97 = vbroadcastsd_avx512f(auVar74);
    uVar64 = 1;
    auVar100 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar98 = vpbroadcastq_avx512f(ZEXT816(0x18));
    auVar99 = vbroadcastsd_avx512f(ZEXT816(0x3fe0000000000000));
    auVar101 = vpbroadcastq_avx512f(ZEXT816(8));
    do {
      if (3 < iVar36) {
        ppcVar38 = (((this->super_maxwell_solver).ce)->p)._M_t.
                   super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                   super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                   super__Head_base<0UL,_celle_***,_false>._M_head_impl[uVar64];
        pcVar39 = ppcVar38[lVar60 + -1];
        pcVar40 = ppcVar38[(int)(iVar35 - 2U)];
        pcVar42 = (pfVar37->p)._M_t.
                  super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                  super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                  super__Head_base<0UL,_cellb_***,_false>._M_head_impl[uVar64][lVar60 + -1];
        auVar103 = vpbroadcastq_avx512f();
        auVar103 = vmovdqu64_avx512f(auVar103);
        auVar104 = vpbroadcastq_avx512f();
        auVar105 = vpbroadcastq_avx512f();
        auVar106 = vpbroadcastq_avx512f();
        auVar107 = vpbroadcastq_avx512f();
        uVar65 = 0;
        auVar108 = vpmovsxbq_avx512f(ZEXT816(0x807060504030201));
        do {
          auVar112 = vpbroadcastq_avx512f();
          auVar112 = vporq_avx512f(auVar112,auVar100);
          uVar58 = vpcmpuq_avx512f(auVar112,auVar102,2);
          auVar112 = vpmullq_avx512dq(auVar108,auVar98);
          vpaddq_avx512f(auVar112,auVar103);
          auVar74 = vxorpd_avx512vl(in_ZMM27._0_16_,in_ZMM27._0_16_);
          auVar109 = vgatherqpd_avx512f(*(undefined8 *)(uVar66 + 0x10));
          bVar56 = (byte)uVar58;
          auVar145._0_8_ =
               (ulong)(bVar56 & 1) * auVar109._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar74._0_8_;
          bVar57 = (bool)((byte)(uVar58 >> 1) & 1);
          auVar145._8_8_ = (ulong)bVar57 * auVar109._8_8_ | (ulong)!bVar57 * auVar74._8_8_;
          auVar145._16_8_ = (ulong)((byte)(uVar58 >> 2) & 1) * auVar109._16_8_;
          auVar145._24_8_ = (ulong)((byte)(uVar58 >> 3) & 1) * auVar109._24_8_;
          auVar145._32_8_ = (ulong)((byte)(uVar58 >> 4) & 1) * auVar109._32_8_;
          auVar145._40_8_ = (ulong)((byte)(uVar58 >> 5) & 1) * auVar109._40_8_;
          auVar145._48_8_ = (ulong)((byte)(uVar58 >> 6) & 1) * auVar109._48_8_;
          auVar145._56_8_ = (uVar58 >> 7) * auVar109._56_8_;
          auVar74 = vxorpd_avx512vl(in_ZMM25._0_16_,in_ZMM25._0_16_);
          auVar109 = vgatherqpd_avx512f(*(undefined8 *)((long)pcVar40 * 2 + 0x10));
          auVar79._0_8_ =
               (ulong)(bVar56 & 1) * auVar109._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar74._0_8_;
          bVar57 = (bool)((byte)(uVar58 >> 1) & 1);
          auVar79._8_8_ = (ulong)bVar57 * auVar109._8_8_ | (ulong)!bVar57 * auVar74._8_8_;
          auVar146._16_8_ = (ulong)((byte)(uVar58 >> 2) & 1) * auVar109._16_8_;
          auVar146._0_16_ = auVar79;
          auVar146._24_8_ = (ulong)((byte)(uVar58 >> 3) & 1) * auVar109._24_8_;
          auVar146._32_8_ = (ulong)((byte)(uVar58 >> 4) & 1) * auVar109._32_8_;
          auVar146._40_8_ = (ulong)((byte)(uVar58 >> 5) & 1) * auVar109._40_8_;
          auVar146._48_8_ = (ulong)((byte)(uVar58 >> 6) & 1) * auVar109._48_8_;
          auVar146._56_8_ = (uVar58 >> 7) * auVar109._56_8_;
          auVar74 = vxorpd_avx512vl(in_ZMM28._0_16_,in_ZMM28._0_16_);
          auVar109 = vsubpd_avx512f(auVar145,auVar146);
          auVar110 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar39[1].ey + (long)pcVar40));
          auVar147._0_8_ =
               (ulong)(bVar56 & 1) * auVar110._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar74._0_8_;
          bVar57 = (bool)((byte)(uVar58 >> 1) & 1);
          auVar147._8_8_ = (ulong)bVar57 * auVar110._8_8_ | (ulong)!bVar57 * auVar74._8_8_;
          auVar147._16_8_ = (ulong)((byte)(uVar58 >> 2) & 1) * auVar110._16_8_;
          auVar147._24_8_ = (ulong)((byte)(uVar58 >> 3) & 1) * auVar110._24_8_;
          auVar147._32_8_ = (ulong)((byte)(uVar58 >> 4) & 1) * auVar110._32_8_;
          auVar147._40_8_ = (ulong)((byte)(uVar58 >> 5) & 1) * auVar110._40_8_;
          auVar147._48_8_ = (ulong)((byte)(uVar58 >> 6) & 1) * auVar110._48_8_;
          auVar147._56_8_ = (uVar58 >> 7) * auVar110._56_8_;
          auVar74 = vxorpd_avx512vl(auVar79,auVar79);
          auVar110 = vgatherqpd_avx512f(*(undefined8 *)(uVar66 + 8));
          auVar148._0_8_ =
               (ulong)(bVar56 & 1) * auVar110._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar74._0_8_;
          bVar57 = (bool)((byte)(uVar58 >> 1) & 1);
          auVar148._8_8_ = (ulong)bVar57 * auVar110._8_8_ | (ulong)!bVar57 * auVar74._8_8_;
          auVar148._16_8_ = (ulong)((byte)(uVar58 >> 2) & 1) * auVar110._16_8_;
          auVar148._24_8_ = (ulong)((byte)(uVar58 >> 3) & 1) * auVar110._24_8_;
          auVar148._32_8_ = (ulong)((byte)(uVar58 >> 4) & 1) * auVar110._32_8_;
          auVar148._40_8_ = (ulong)((byte)(uVar58 >> 5) & 1) * auVar110._40_8_;
          auVar148._48_8_ = (ulong)((byte)(uVar58 >> 6) & 1) * auVar110._48_8_;
          auVar148._56_8_ = (uVar58 >> 7) * auVar110._56_8_;
          auVar110 = vsubpd_avx512f(auVar147,auVar148);
          auVar109 = vmulpd_avx512f(auVar90,auVar109);
          auVar74 = vxorpd_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
          auVar111 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar39[2].ey + (long)pcVar40));
          auVar80._0_8_ =
               (ulong)(bVar56 & 1) * auVar111._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar74._0_8_;
          bVar57 = (bool)((byte)(uVar58 >> 1) & 1);
          auVar80._8_8_ = (ulong)bVar57 * auVar111._8_8_ | (ulong)!bVar57 * auVar74._8_8_;
          auVar149._16_8_ = (ulong)((byte)(uVar58 >> 2) & 1) * auVar111._16_8_;
          auVar149._0_16_ = auVar80;
          auVar149._24_8_ = (ulong)((byte)(uVar58 >> 3) & 1) * auVar111._24_8_;
          auVar149._32_8_ = (ulong)((byte)(uVar58 >> 4) & 1) * auVar111._32_8_;
          auVar149._40_8_ = (ulong)((byte)(uVar58 >> 5) & 1) * auVar111._40_8_;
          auVar149._48_8_ = (ulong)((byte)(uVar58 >> 6) & 1) * auVar111._48_8_;
          auVar149._56_8_ = (uVar58 >> 7) * auVar111._56_8_;
          auVar111 = vsubpd_avx512f(auVar149,auVar147);
          auVar74 = vxorpd_avx512vl(auVar80,auVar80);
          auVar111 = vaddpd_avx512f(auVar148,auVar111);
          auVar113 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar39[-1].ey + (long)pcVar40));
          auVar150._0_8_ =
               (ulong)(bVar56 & 1) * auVar113._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar74._0_8_;
          bVar57 = (bool)((byte)(uVar58 >> 1) & 1);
          auVar150._8_8_ = (ulong)bVar57 * auVar113._8_8_ | (ulong)!bVar57 * auVar74._8_8_;
          auVar150._16_8_ = (ulong)((byte)(uVar58 >> 2) & 1) * auVar113._16_8_;
          auVar150._24_8_ = (ulong)((byte)(uVar58 >> 3) & 1) * auVar113._24_8_;
          auVar150._32_8_ = (ulong)((byte)(uVar58 >> 4) & 1) * auVar113._32_8_;
          auVar150._40_8_ = (ulong)((byte)(uVar58 >> 5) & 1) * auVar113._40_8_;
          auVar150._48_8_ = (ulong)((byte)(uVar58 >> 6) & 1) * auVar113._48_8_;
          auVar150._56_8_ = (uVar58 >> 7) * auVar113._56_8_;
          auVar111 = vsubpd_avx512f(auVar111,auVar150);
          auVar111 = vmulpd_avx512f(auVar91,auVar111);
          auVar110 = vfmadd231pd_avx512f(auVar111,auVar92,auVar110);
          auVar109 = vfnmadd231pd_avx512f(auVar109,auVar86,auVar145);
          auVar111 = vmulpd_avx512f(auVar88,auVar110);
          auVar109 = vfmadd231pd_avx512f(auVar111,auVar95,auVar109);
          auVar74 = vxorpd_avx512vl(auVar110._0_16_,auVar110._0_16_);
          auVar110 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar40->ex + (long)&pcVar42->bx));
          auVar151._0_8_ =
               (ulong)(bVar56 & 1) * auVar110._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar74._0_8_;
          bVar57 = (bool)((byte)(uVar58 >> 1) & 1);
          auVar151._8_8_ = (ulong)bVar57 * auVar110._8_8_ | (ulong)!bVar57 * auVar74._8_8_;
          auVar151._16_8_ = (ulong)((byte)(uVar58 >> 2) & 1) * auVar110._16_8_;
          auVar151._24_8_ = (ulong)((byte)(uVar58 >> 3) & 1) * auVar110._24_8_;
          auVar151._32_8_ = (ulong)((byte)(uVar58 >> 4) & 1) * auVar110._32_8_;
          auVar151._40_8_ = (ulong)((byte)(uVar58 >> 5) & 1) * auVar110._40_8_;
          auVar151._48_8_ = (ulong)((byte)(uVar58 >> 6) & 1) * auVar110._48_8_;
          auVar151._56_8_ = (uVar58 >> 7) * auVar110._56_8_;
          auVar109 = vfmadd231pd_avx512f(auVar151,auVar99,auVar109);
          vscatterqpd_avx512f(ZEXT864(pcVar42) + auVar94,uVar58,auVar109);
          auVar110 = vpaddq_avx512f(auVar105,auVar112);
          auVar74 = vxorpd_avx512vl(auVar109._0_16_,auVar109._0_16_);
          auVar109 = vgatherqpd_avx512f(*(undefined8 *)(uVar66 + 0x10));
          auVar152._0_8_ =
               (ulong)(bVar56 & 1) * auVar109._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar74._0_8_;
          bVar57 = (bool)((byte)(uVar58 >> 1) & 1);
          auVar152._8_8_ = (ulong)bVar57 * auVar109._8_8_ | (ulong)!bVar57 * auVar74._8_8_;
          auVar152._16_8_ = (ulong)((byte)(uVar58 >> 2) & 1) * auVar109._16_8_;
          auVar152._24_8_ = (ulong)((byte)(uVar58 >> 3) & 1) * auVar109._24_8_;
          auVar152._32_8_ = (ulong)((byte)(uVar58 >> 4) & 1) * auVar109._32_8_;
          auVar152._40_8_ = (ulong)((byte)(uVar58 >> 5) & 1) * auVar109._40_8_;
          auVar152._48_8_ = (ulong)((byte)(uVar58 >> 6) & 1) * auVar109._48_8_;
          auVar152._56_8_ = (uVar58 >> 7) * auVar109._56_8_;
          auVar109 = vsubpd_avx512f(auVar152,auVar145);
          in_ZMM30 = vpaddq_avx512f(auVar106,auVar112);
          auVar74 = vxorpd_avx512vl(auVar67,auVar67);
          auVar111 = vgatherqpd_avx512f(*(undefined8 *)(uVar62 + 0x10));
          auVar81._0_8_ =
               (ulong)(bVar56 & 1) * auVar111._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar74._0_8_;
          bVar57 = (bool)((byte)(uVar58 >> 1) & 1);
          auVar81._8_8_ = (ulong)bVar57 * auVar111._8_8_ | (ulong)!bVar57 * auVar74._8_8_;
          auVar153._16_8_ = (ulong)((byte)(uVar58 >> 2) & 1) * auVar111._16_8_;
          auVar153._0_16_ = auVar81;
          auVar153._24_8_ = (ulong)((byte)(uVar58 >> 3) & 1) * auVar111._24_8_;
          auVar153._32_8_ = (ulong)((byte)(uVar58 >> 4) & 1) * auVar111._32_8_;
          auVar153._40_8_ = (ulong)((byte)(uVar58 >> 5) & 1) * auVar111._40_8_;
          auVar153._48_8_ = (ulong)((byte)(uVar58 >> 6) & 1) * auVar111._48_8_;
          auVar153._56_8_ = (uVar58 >> 7) * auVar111._56_8_;
          auVar111 = vsubpd_avx512f(auVar153,auVar152);
          auVar111 = vaddpd_avx512f(auVar145,auVar111);
          in_ZMM28 = vpaddq_avx512f(auVar107,auVar112);
          auVar74 = vxorpd_avx512vl(auVar81,auVar81);
          auVar113 = vgatherqpd_avx512f(*(undefined8 *)(uVar65 + 0x10));
          auVar82._0_8_ =
               (ulong)(bVar56 & 1) * auVar113._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar74._0_8_;
          bVar57 = (bool)((byte)(uVar58 >> 1) & 1);
          auVar82._8_8_ = (ulong)bVar57 * auVar113._8_8_ | (ulong)!bVar57 * auVar74._8_8_;
          auVar154._16_8_ = (ulong)((byte)(uVar58 >> 2) & 1) * auVar113._16_8_;
          auVar154._0_16_ = auVar82;
          auVar154._24_8_ = (ulong)((byte)(uVar58 >> 3) & 1) * auVar113._24_8_;
          auVar154._32_8_ = (ulong)((byte)(uVar58 >> 4) & 1) * auVar113._32_8_;
          auVar154._40_8_ = (ulong)((byte)(uVar58 >> 5) & 1) * auVar113._40_8_;
          auVar154._48_8_ = (ulong)((byte)(uVar58 >> 6) & 1) * auVar113._48_8_;
          auVar154._56_8_ = (uVar58 >> 7) * auVar113._56_8_;
          auVar111 = vsubpd_avx512f(auVar111,auVar154);
          auVar74 = vxorpd_avx512vl(auVar82,auVar82);
          auVar113 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar40->ex + (long)&pcVar39[1].ex));
          auVar155._0_8_ =
               (ulong)(bVar56 & 1) * auVar113._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar74._0_8_;
          bVar57 = (bool)((byte)(uVar58 >> 1) & 1);
          auVar155._8_8_ = (ulong)bVar57 * auVar113._8_8_ | (ulong)!bVar57 * auVar74._8_8_;
          auVar155._16_8_ = (ulong)((byte)(uVar58 >> 2) & 1) * auVar113._16_8_;
          auVar155._24_8_ = (ulong)((byte)(uVar58 >> 3) & 1) * auVar113._24_8_;
          auVar155._32_8_ = (ulong)((byte)(uVar58 >> 4) & 1) * auVar113._32_8_;
          auVar155._40_8_ = (ulong)((byte)(uVar58 >> 5) & 1) * auVar113._40_8_;
          auVar155._48_8_ = (ulong)((byte)(uVar58 >> 6) & 1) * auVar113._48_8_;
          auVar155._56_8_ = (uVar58 >> 7) * auVar113._56_8_;
          auVar102 = vmovdqa64_avx512f(auVar102);
          auVar101 = vmovdqa64_avx512f(auVar101);
          auVar100 = vmovdqa64_avx512f(auVar100);
          auVar111 = vmulpd_avx512f(auVar93,auVar111);
          auVar113 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar40->ex + (long)&pcVar39->ex));
          auVar156._8_8_ = (ulong)((byte)(uVar58 >> 1) & 1) * auVar113._8_8_;
          auVar156._0_8_ = (ulong)(bVar56 & 1) * auVar113._0_8_;
          auVar156._16_8_ = (ulong)((byte)(uVar58 >> 2) & 1) * auVar113._16_8_;
          auVar156._24_8_ = (ulong)((byte)(uVar58 >> 3) & 1) * auVar113._24_8_;
          auVar156._32_8_ = (ulong)((byte)(uVar58 >> 4) & 1) * auVar113._32_8_;
          auVar156._40_8_ = (ulong)((byte)(uVar58 >> 5) & 1) * auVar113._40_8_;
          auVar156._48_8_ = (ulong)((byte)(uVar58 >> 6) & 1) * auVar113._48_8_;
          auVar156._56_8_ = (uVar58 >> 7) * auVar113._56_8_;
          auVar113 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar40->ex + (long)&pcVar39[2].ex));
          auVar157._8_8_ = (ulong)((byte)(uVar58 >> 1) & 1) * auVar113._8_8_;
          auVar157._0_8_ = (ulong)(bVar56 & 1) * auVar113._0_8_;
          auVar157._16_8_ = (ulong)((byte)(uVar58 >> 2) & 1) * auVar113._16_8_;
          auVar157._24_8_ = (ulong)((byte)(uVar58 >> 3) & 1) * auVar113._24_8_;
          auVar157._32_8_ = (ulong)((byte)(uVar58 >> 4) & 1) * auVar113._32_8_;
          auVar157._40_8_ = (ulong)((byte)(uVar58 >> 5) & 1) * auVar113._40_8_;
          auVar157._48_8_ = (ulong)((byte)(uVar58 >> 6) & 1) * auVar113._48_8_;
          auVar157._56_8_ = (uVar58 >> 7) * auVar113._56_8_;
          auVar113 = vsubpd_avx512f(auVar157,auVar155);
          auVar111 = vfmadd231pd_avx512f(auVar111,auVar94,auVar109);
          auVar113 = vaddpd_avx512f(auVar156,auVar113);
          auVar74 = vxorpd_avx512vl(auVar109._0_16_,auVar109._0_16_);
          auVar109 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar40->ex + (long)&pcVar39[-1].ex))
          ;
          auVar158._0_8_ =
               (ulong)(bVar56 & 1) * auVar109._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar74._0_8_;
          bVar57 = (bool)((byte)(uVar58 >> 1) & 1);
          auVar158._8_8_ = (ulong)bVar57 * auVar109._8_8_ | (ulong)!bVar57 * auVar74._8_8_;
          auVar158._16_8_ = (ulong)((byte)(uVar58 >> 2) & 1) * auVar109._16_8_;
          auVar158._24_8_ = (ulong)((byte)(uVar58 >> 3) & 1) * auVar109._24_8_;
          auVar158._32_8_ = (ulong)((byte)(uVar58 >> 4) & 1) * auVar109._32_8_;
          auVar158._40_8_ = (ulong)((byte)(uVar58 >> 5) & 1) * auVar109._40_8_;
          auVar158._48_8_ = (ulong)((byte)(uVar58 >> 6) & 1) * auVar109._48_8_;
          auVar158._56_8_ = (uVar58 >> 7) * auVar109._56_8_;
          auVar109 = vsubpd_avx512f(auVar113,auVar158);
          auVar113 = vsubpd_avx512f(auVar155,auVar156);
          auVar109 = vmulpd_avx512f(auVar91,auVar109);
          auVar109 = vfmadd231pd_avx512f(auVar109,auVar92,auVar113);
          auVar109 = vmulpd_avx512f(auVar109,auVar96);
          auVar109 = vfmadd231pd_avx512f(auVar109,auVar87,auVar111);
          auVar74 = vxorpd_avx512vl(auVar111._0_16_,auVar111._0_16_);
          vpaddq_avx512f(auVar104,auVar112);
          auVar111 = vgatherqpd_avx512f(*(undefined8 *)(lVar60 + 8));
          auVar159._0_8_ =
               (ulong)(bVar56 & 1) * auVar111._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar74._0_8_;
          bVar57 = (bool)((byte)(uVar58 >> 1) & 1);
          auVar159._8_8_ = (ulong)bVar57 * auVar111._8_8_ | (ulong)!bVar57 * auVar74._8_8_;
          auVar159._16_8_ = (ulong)((byte)(uVar58 >> 2) & 1) * auVar111._16_8_;
          auVar159._24_8_ = (ulong)((byte)(uVar58 >> 3) & 1) * auVar111._24_8_;
          auVar159._32_8_ = (ulong)((byte)(uVar58 >> 4) & 1) * auVar111._32_8_;
          auVar159._40_8_ = (ulong)((byte)(uVar58 >> 5) & 1) * auVar111._40_8_;
          auVar159._48_8_ = (ulong)((byte)(uVar58 >> 6) & 1) * auVar111._48_8_;
          auVar159._56_8_ = (uVar58 >> 7) * auVar111._56_8_;
          in_ZMM27 = vfmadd231pd_avx512f(auVar159,auVar99,auVar109);
          vscatterqpd_avx512f(ZEXT864(8) + auVar156,uVar58,in_ZMM27);
          auVar109 = vgatherqpd_avx512f(*(undefined8 *)((long)pcVar40 * 2));
          auVar160._8_8_ = (ulong)((byte)(uVar58 >> 1) & 1) * auVar109._8_8_;
          auVar160._0_8_ = (ulong)(bVar56 & 1) * auVar109._0_8_;
          auVar160._16_8_ = (ulong)((byte)(uVar58 >> 2) & 1) * auVar109._16_8_;
          auVar160._24_8_ = (ulong)((byte)(uVar58 >> 3) & 1) * auVar109._24_8_;
          auVar160._32_8_ = (ulong)((byte)(uVar58 >> 4) & 1) * auVar109._32_8_;
          auVar160._40_8_ = (ulong)((byte)(uVar58 >> 5) & 1) * auVar109._40_8_;
          auVar160._48_8_ = (ulong)((byte)(uVar58 >> 6) & 1) * auVar109._48_8_;
          auVar160._56_8_ = (uVar58 >> 7) * auVar109._56_8_;
          auVar74 = vxorpd_avx512vl(auVar112._0_16_,auVar112._0_16_);
          auVar112 = vgatherqpd_avx512f(*(undefined8 *)(uVar66 + 8));
          auVar161._0_8_ =
               (ulong)(bVar56 & 1) * auVar112._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar74._0_8_;
          bVar57 = (bool)((byte)(uVar58 >> 1) & 1);
          auVar161._8_8_ = (ulong)bVar57 * auVar112._8_8_ | (ulong)!bVar57 * auVar74._8_8_;
          auVar161._16_8_ = (ulong)((byte)(uVar58 >> 2) & 1) * auVar112._16_8_;
          auVar161._24_8_ = (ulong)((byte)(uVar58 >> 3) & 1) * auVar112._24_8_;
          auVar161._32_8_ = (ulong)((byte)(uVar58 >> 4) & 1) * auVar112._32_8_;
          auVar161._40_8_ = (ulong)((byte)(uVar58 >> 5) & 1) * auVar112._40_8_;
          auVar161._48_8_ = (ulong)((byte)(uVar58 >> 6) & 1) * auVar112._48_8_;
          auVar161._56_8_ = (uVar58 >> 7) * auVar112._56_8_;
          auVar74 = vxorpd_avx512vl(auVar110._0_16_,auVar110._0_16_);
          auVar112 = vgatherqpd_avx512f(*(undefined8 *)(uVar62 + 8));
          auVar162._0_8_ =
               (ulong)(bVar56 & 1) * auVar112._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar74._0_8_;
          bVar57 = (bool)((byte)(uVar58 >> 1) & 1);
          auVar162._8_8_ = (ulong)bVar57 * auVar112._8_8_ | (ulong)!bVar57 * auVar74._8_8_;
          auVar162._16_8_ = (ulong)((byte)(uVar58 >> 2) & 1) * auVar112._16_8_;
          auVar162._24_8_ = (ulong)((byte)(uVar58 >> 3) & 1) * auVar112._24_8_;
          auVar162._32_8_ = (ulong)((byte)(uVar58 >> 4) & 1) * auVar112._32_8_;
          auVar162._40_8_ = (ulong)((byte)(uVar58 >> 5) & 1) * auVar112._40_8_;
          auVar162._48_8_ = (ulong)((byte)(uVar58 >> 6) & 1) * auVar112._48_8_;
          auVar162._56_8_ = (uVar58 >> 7) * auVar112._56_8_;
          auVar112 = vsubpd_avx512f(auVar162,auVar161);
          auVar109 = vsubpd_avx512f(auVar161,auVar148);
          auVar110 = vaddpd_avx512f(auVar148,auVar112);
          auVar74 = vxorpd_avx512vl(auVar112._0_16_,auVar112._0_16_);
          auVar112 = vgatherqpd_avx512f(*(undefined8 *)(uVar65 + 8));
          auVar163._0_8_ =
               (ulong)(bVar56 & 1) * auVar112._0_8_ | (ulong)!(bool)(bVar56 & 1) * auVar74._0_8_;
          bVar57 = (bool)((byte)(uVar58 >> 1) & 1);
          auVar163._8_8_ = (ulong)bVar57 * auVar112._8_8_ | (ulong)!bVar57 * auVar74._8_8_;
          auVar163._16_8_ = (ulong)((byte)(uVar58 >> 2) & 1) * auVar112._16_8_;
          auVar163._24_8_ = (ulong)((byte)(uVar58 >> 3) & 1) * auVar112._24_8_;
          auVar163._32_8_ = (ulong)((byte)(uVar58 >> 4) & 1) * auVar112._32_8_;
          auVar163._40_8_ = (ulong)((byte)(uVar58 >> 5) & 1) * auVar112._40_8_;
          auVar163._48_8_ = (ulong)((byte)(uVar58 >> 6) & 1) * auVar112._48_8_;
          auVar163._56_8_ = (uVar58 >> 7) * auVar112._56_8_;
          in_ZMM25 = vsubpd_avx512f(auVar110,auVar163);
          auVar112 = vsubpd_avx512f(auVar156,auVar160);
          auVar112 = vmulpd_avx512f(auVar90,auVar112);
          auVar112 = vfnmadd231pd_avx512f(auVar112,auVar86,auVar156);
          auVar110 = vmulpd_avx512f(auVar93,in_ZMM25);
          auVar109 = vfmadd231pd_avx512f(auVar110,auVar94,auVar109);
          auVar109 = vmulpd_avx512f(auVar109,auVar97);
          auVar112 = vfmadd231pd_avx512f(auVar109,auVar89,auVar112);
          auVar109 = vgatherqpd_avx512f(*(undefined8 *)(lVar60 + 0x10));
          auVar164._8_8_ = (ulong)((byte)(uVar58 >> 1) & 1) * auVar109._8_8_;
          auVar164._0_8_ = (ulong)(bVar56 & 1) * auVar109._0_8_;
          auVar164._16_8_ = (ulong)((byte)(uVar58 >> 2) & 1) * auVar109._16_8_;
          auVar164._24_8_ = (ulong)((byte)(uVar58 >> 3) & 1) * auVar109._24_8_;
          auVar164._32_8_ = (ulong)((byte)(uVar58 >> 4) & 1) * auVar109._32_8_;
          auVar164._40_8_ = (ulong)((byte)(uVar58 >> 5) & 1) * auVar109._40_8_;
          auVar164._48_8_ = (ulong)((byte)(uVar58 >> 6) & 1) * auVar109._48_8_;
          auVar164._56_8_ = (uVar58 >> 7) * auVar109._56_8_;
          auVar112 = vfmadd231pd_avx512f(auVar164,auVar99,auVar112);
          auVar100 = vmovdqa64_avx512f(auVar100);
          auVar101 = vmovdqa64_avx512f(auVar101);
          auVar102 = vmovdqa64_avx512f(auVar102);
          vscatterqpd_avx512f(ZEXT864(0x10) + auVar100,uVar58,auVar112);
          uVar65 = uVar65 + 8;
          auVar108 = vpaddq_avx512f(auVar108,auVar101);
        } while (uVar62 != uVar65);
      }
      uVar64 = uVar64 + 1;
    } while (uVar64 != uVar59);
  }
  if (3 < iVar34) {
    dVar1 = (this->super_maxwell_solver).dtdy;
    auVar165._8_8_ = 0;
    auVar165._0_8_ = dVar1;
    auVar167._0_8_ = -dVar1;
    auVar167._8_8_ = 0x8000000000000000;
    pfVar43 = (this->super_maxwell_solver).ce;
    auVar7._0_8_ = this->bx;
    auVar7._8_8_ = this->by;
    auVar8._0_8_ = this->ax;
    auVar8._8_8_ = this->ay;
    dVar1 = (this->super_maxwell_solver).dtdz;
    auVar168._8_8_ = 0;
    auVar168._0_8_ = dVar1;
    auVar169._0_8_ = -dVar1;
    auVar169._8_8_ = 0x8000000000000000;
    dVar1 = (this->super_maxwell_solver).dtdx;
    auVar171._8_8_ = 0;
    auVar171._0_8_ = dVar1;
    auVar74 = vunpcklpd_avx(auVar171,auVar167);
    auVar67 = vunpcklpd_avx(auVar169,auVar168);
    auVar170._8_8_ = this->bz;
    auVar170._0_8_ = this->bz;
    dVar2 = this->az;
    auVar172._8_8_ = 0;
    auVar172._0_8_ = this->by;
    auVar173._8_8_ = 0;
    auVar173._0_8_ = this->ay;
    local_78 = 1;
    lVar60 = (lVar63 + -1) * 0x18;
    auVar176._8_8_ = 0x3fe0000000000000;
    auVar176._0_8_ = 0x3fe0000000000000;
    do {
      if (3 < iVar35) {
        pppcVar44 = (pfVar43->p)._M_t.
                    super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                    super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                    super__Head_base<0UL,_celle_***,_false>._M_head_impl;
        ppcVar38 = pppcVar44[local_78 - 1];
        ppcVar45 = pppcVar44[local_78];
        ppcVar46 = (pfVar37->p)._M_t.
                   super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                   super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                   super__Head_base<0UL,_cellb_***,_false>._M_head_impl[local_78];
        ppcVar47 = pppcVar44[local_78 + 1];
        ppcVar48 = pppcVar44[local_78 + 2];
        lVar61 = 0;
        do {
          lVar49 = *(long *)((long)ppcVar45 + lVar61 + 0x10);
          lVar50 = *(long *)((long)ppcVar45 + lVar61);
          lVar51 = *(long *)((long)ppcVar45 + lVar61 + 8);
          lVar52 = *(long *)((long)ppcVar45 + lVar61 + 0x18);
          lVar53 = *(long *)((long)ppcVar46 + lVar61 + 8);
          lVar54 = *(long *)((long)ppcVar47 + lVar61 + 8);
          lVar55 = *(long *)((long)ppcVar48 + lVar61 + 8);
          uVar3 = *(undefined8 *)(lVar51 + 0x10 + lVar60);
          auVar180._8_8_ = uVar3;
          auVar180._0_8_ = uVar3;
          auVar68 = *(undefined1 (*) [16])(lVar51 + lVar60);
          auVar85 = vsubpd_avx(auVar68,*(undefined1 (*) [16])(lVar51 + -0x30 + lVar63 * 0x18));
          dVar4 = *(double *)(lVar51 + 8 + lVar60);
          auVar190._8_8_ = 0;
          auVar190._0_8_ = dVar4;
          lVar51 = *(long *)((long)ppcVar38 + lVar61 + 8);
          uVar3 = *(undefined8 *)(lVar49 + 0x10 + lVar60);
          auVar191._8_8_ = uVar3;
          auVar191._0_8_ = uVar3;
          uVar3 = *(undefined8 *)(lVar52 + 0x10 + lVar60);
          auVar193._8_8_ = uVar3;
          auVar193._0_8_ = uVar3;
          auVar83 = vsubpd_avx512vl(auVar193,auVar191);
          auVar84 = vsubpd_avx512vl(auVar191,auVar180);
          auVar83 = vaddpd_avx512vl(auVar180,auVar83);
          uVar3 = *(undefined8 *)(lVar50 + 0x10 + lVar60);
          auVar194._8_8_ = uVar3;
          auVar194._0_8_ = uVar3;
          auVar83 = vsubpd_avx512vl(auVar83,auVar194);
          auVar181._0_8_ = auVar83._0_8_ * (double)auVar8._0_8_;
          auVar181._8_8_ = auVar83._8_8_ * (double)auVar8._8_8_;
          auVar83 = vfmadd231pd_avx512vl(auVar181,auVar7,auVar84);
          auVar186._0_8_ = auVar85._0_8_ * dVar2;
          auVar186._8_8_ = auVar85._8_8_ * dVar2;
          auVar85 = vfnmadd231pd_fma(auVar186,auVar170,auVar68);
          auVar187._0_8_ = auVar85._0_8_ * auVar67._0_8_;
          auVar187._8_8_ = auVar85._8_8_ * auVar67._8_8_;
          auVar83 = vfmadd231pd_fma(auVar187,auVar74,auVar83);
          auVar85 = vpermilpd_avx(*(undefined1 (*) [16])(lVar53 + lVar60),1);
          auVar85 = vfmadd231pd_fma(auVar85,auVar83,auVar176);
          auVar85 = vshufpd_avx(auVar85,auVar85,1);
          *(undefined1 (*) [16])(lVar53 + lVar60) = auVar85;
          dVar5 = *(double *)(lVar49 + lVar60);
          auVar182._8_8_ = 0;
          auVar182._0_8_ = dVar5;
          dVar6 = *(double *)(lVar54 + 8 + lVar60);
          auVar188._8_8_ = 0;
          auVar188._0_8_ = dVar6;
          auVar192._8_8_ = 0;
          auVar192._0_8_ = *(ulong *)(lVar55 + 8 + lVar60);
          auVar85 = vsubsd_avx512f(auVar192,auVar188);
          auVar85 = vaddsd_avx512f(auVar190,auVar85);
          auVar31._8_8_ = 0;
          auVar31._0_8_ = *(ulong *)(lVar51 + 8 + lVar60);
          auVar85 = vsubsd_avx512f(auVar85,auVar31);
          auVar195._8_8_ = 0;
          auVar195._0_8_ = *(ulong *)(lVar52 + lVar60);
          auVar83 = vsubsd_avx512f(auVar195,auVar182);
          auVar83 = vaddsd_avx512f(auVar68,auVar83);
          auVar32._8_8_ = 0;
          auVar32._0_8_ = *(ulong *)(lVar50 + lVar60);
          auVar83 = vsubsd_avx512f(auVar83,auVar32);
          auVar83 = vmulsd_avx512f(auVar173,auVar83);
          auVar85 = vmulsd_avx512f(auVar8,auVar85);
          auVar189._8_8_ = 0;
          auVar189._0_8_ = dVar6 - dVar4;
          auVar85 = vfmadd231sd_fma(auVar85,auVar7,auVar189);
          auVar183._8_8_ = 0;
          auVar183._0_8_ = dVar5 - auVar68._0_8_;
          auVar68 = vfmadd231sd_fma(auVar83,auVar172,auVar183);
          auVar184._8_8_ = 0;
          auVar184._0_8_ = auVar85._0_8_ * -dVar1;
          auVar68 = vfmadd231sd_fma(auVar184,auVar165,auVar68);
          auVar33._8_8_ = 0;
          auVar33._0_8_ = *(ulong *)(lVar53 + 0x10 + lVar60);
          auVar68 = vfmadd213sd_fma(auVar68,ZEXT816(0x3fe0000000000000),auVar33);
          *(long *)(lVar53 + 0x10 + lVar60) = auVar68._0_8_;
          lVar61 = lVar61 + 8;
        } while (uVar66 * 8 + -8 != lVar61);
      }
      local_78 = local_78 + 1;
    } while (local_78 != uVar59);
  }
  return;
}

Assistant:

void five_point_solver::advance_b()
{
    const int nx = cb.get_nx();
    const int ny = cb.get_ny();
    const int nz = cb.get_nz();
    // 1/2 b advance
    for(int i=1;i<nx-2;i++) {
        for(int j=1;j<ny-2;j++) {
            for(int k=1;k<nz-2;k++) {
                cb[i][j][k].bx += 0.5*(   -dtdy*( by*(ce[i][j+1][k].ez-ce[i][j][k].ez) + ay*(ce[i][j+2][k].ez-ce[i][j+1][k].ez+ce[i][j][k].ez-ce[i][j-1][k].ez) )    +   dtdz*( bz*(ce[i][j][k+1].ey-ce[i][j][k].ey) + az*(ce[i][j][k+2].ey-ce[i][j][k+1].ey+ce[i][j][k].ey-ce[i][j][k-1].ey) )  );

                cb[i][j][k].by += 0.5*(   dtdx*( bx*(ce[i+1][j][k].ez-ce[i][j][k].ez) + ax*(ce[i+2][j][k].ez-ce[i+1][j][k].ez+ce[i][j][k].ez-ce[i-1][j][k].ez) )    -   dtdz*( bz*(ce[i][j][k+1].ex-ce[i][j][k].ex) + az*(ce[i][j][k+2].ex-ce[i][j][k+1].ex+ce[i][j][k].ex-ce[i][j][k-1].ex) )  );

                cb[i][j][k].bz += 0.5*(   dtdy*( by*(ce[i][j+1][k].ex-ce[i][j][k].ex) + ay*(ce[i][j+2][k].ex-ce[i][j+1][k].ex+ce[i][j][k].ex-ce[i][j-1][k].ex) )    -   dtdx*( bx*(ce[i+1][j][k].ey-ce[i][j][k].ey) + ax*(ce[i+2][j][k].ey-ce[i+1][j][k].ey+ce[i][j][k].ey-ce[i-1][j][k].ey))  );
            }
        }
    }
    {int i=nx-1;
        for(int j=1;j<ny-2;j++) {
            for(int k=1;k<nz-2;k++) {
                cb[i][j][k].bx += 0.5*(   -dtdy*( by*(ce[i][j+1][k].ez-ce[i][j][k].ez) + ay*(ce[i][j+2][k].ez-ce[i][j+1][k].ez+ce[i][j][k].ez-ce[i][j-1][k].ez) )    +   dtdz*( bz*(ce[i][j][k+1].ey-ce[i][j][k].ey) + az*(ce[i][j][k+2].ey-ce[i][j][k+1].ey+ce[i][j][k].ey-ce[i][j][k-1].ey) )  );

                cb[i][j][k].by += 0.5*(   dtdx*( bx*(-ce[i][j][k].ez) + ax*(ce[i][j][k].ez-ce[i-1][j][k].ez) )    -   dtdz*( bz*(ce[i][j][k+1].ex-ce[i][j][k].ex) + az*(ce[i][j][k+2].ex-ce[i][j][k+1].ex+ce[i][j][k].ex-ce[i][j][k-1].ex) )  );

                cb[i][j][k].bz += 0.5*(   dtdy*( by*(ce[i][j+1][k].ex-ce[i][j][k].ex) + ay*(ce[i][j+2][k].ex-ce[i][j+1][k].ex+ce[i][j][k].ex-ce[i][j-1][k].ex) )    -   dtdx*( bx*(-ce[i][j][k].ey) + ax*(ce[i][j][k].ey-ce[i-1][j][k].ey))  );
            }
        }
    }
    for(int i=1;i<nx-2;i++) {
        {int j=ny-1;
            for(int k=1;k<nz-2;k++) {
                cb[i][j][k].bx += 0.5*(   -dtdy*( by*(-ce[i][j][k].ez) + ay*(ce[i][j][k].ez-ce[i][j-1][k].ez) )    +   dtdz*( bz*(ce[i][j][k+1].ey-ce[i][j][k].ey) + az*(ce[i][j][k+2].ey-ce[i][j][k+1].ey+ce[i][j][k].ey-ce[i][j][k-1].ey) )  );

                cb[i][j][k].by += 0.5*(   dtdx*( bx*(ce[i+1][j][k].ez-ce[i][j][k].ez) + ax*(ce[i+2][j][k].ez-ce[i+1][j][k].ez+ce[i][j][k].ez-ce[i-1][j][k].ez) )    -   dtdz*( bz*(ce[i][j][k+1].ex-ce[i][j][k].ex) + az*(ce[i][j][k+2].ex-ce[i][j][k+1].ex+ce[i][j][k].ex-ce[i][j][k-1].ex) )  );

                cb[i][j][k].bz += 0.5*(   dtdy*( by*(-ce[i][j][k].ex) + ay*(ce[i][j][k].ex-ce[i][j-1][k].ex) )    -   dtdx*( bx*(ce[i+1][j][k].ey-ce[i][j][k].ey) + ax*(ce[i+2][j][k].ey-ce[i+1][j][k].ey+ce[i][j][k].ey-ce[i-1][j][k].ey))  );
            }
        }
    }
    for(int i=1;i<nx-2;i++) {
        for(int j=1;j<ny-2;j++) {
            {int k=nz-1;
                cb[i][j][k].bx += 0.5*(   -dtdy*( by*(ce[i][j+1][k].ez-ce[i][j][k].ez) + ay*(ce[i][j+2][k].ez-ce[i][j+1][k].ez+ce[i][j][k].ez-ce[i][j-1][k].ez) )    +   dtdz*( bz*(-ce[i][j][k].ey) + az*(ce[i][j][k].ey-ce[i][j][k-1].ey) )  );

                cb[i][j][k].by += 0.5*(   dtdx*( bx*(ce[i+1][j][k].ez-ce[i][j][k].ez) + ax*(ce[i+2][j][k].ez-ce[i+1][j][k].ez+ce[i][j][k].ez-ce[i-1][j][k].ez) )    -   dtdz*( bz*(-ce[i][j][k].ex) + az*(ce[i][j][k].ex-ce[i][j][k-1].ex) )  );

                cb[i][j][k].bz += 0.5*(   dtdy*( by*(ce[i][j+1][k].ex-ce[i][j][k].ex) + ay*(ce[i][j+2][k].ex-ce[i][j+1][k].ex+ce[i][j][k].ex-ce[i][j-1][k].ex) )    -   dtdx*( bx*(ce[i+1][j][k].ey-ce[i][j][k].ey) + ax*(ce[i+2][j][k].ey-ce[i+1][j][k].ey+ce[i][j][k].ey-ce[i-1][j][k].ey))  );
            }
        }
    }
}